

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  Split *pSVar3;
  __pointer_type pBVar4;
  BBox1f BVar5;
  MemoryMonitorInterface *pMVar6;
  ThreadLocal2 *pTVar7;
  iterator iVar8;
  BBox1f *pBVar9;
  PrimRefMB *pPVar10;
  Geometry *pGVar11;
  long lVar12;
  uint uVar13;
  undefined8 uVar14;
  bool bVar15;
  vint *pvVar16;
  unsigned_long uVar17;
  unsigned_long uVar18;
  char cVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *this_00;
  void *pvVar23;
  size_t sVar24;
  undefined8 *puVar25;
  runtime_error *prVar26;
  long lVar27;
  BBox1f BVar28;
  float *pfVar29;
  __pointer_type *ppBVar30;
  Split *pSVar31;
  ulong uVar32;
  PrimRefMB *pPVar33;
  char *pcVar34;
  ulong uVar35;
  BuildRecord *in_00;
  uint uVar36;
  undefined8 uVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  long *plVar42;
  long lVar43;
  long lVar44;
  mvector<PrimRefMB> *prims;
  Split *pSVar45;
  code *pcVar46;
  BBox1f *pBVar47;
  long lVar48;
  ulong uVar49;
  __pointer_type pBVar50;
  size_t i;
  bool bVar51;
  undefined4 uVar52;
  undefined1 auVar53 [16];
  undefined8 uVar55;
  undefined1 auVar54 [16];
  float fVar56;
  float fVar57;
  undefined1 auVar58 [16];
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar65;
  float fVar66;
  undefined1 auVar64 [16];
  float fVar67;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar68 [16];
  float fVar72;
  float fVar75;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
  *pBVar93;
  BBox1f local_1e90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e88;
  Scene *local_1e70;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e68;
  BBox1f local_1e50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e28;
  NodeRecordMB4D *local_1e10;
  undefined1 (*local_1e08) [16];
  __atomic_base<unsigned_long> *local_1e00;
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  undefined1 local_1db8 [16];
  PrimInfoMB right;
  vuint<4> v2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cf8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ce8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cd8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cc8;
  __pointer_type local_1cb8;
  __pointer_type pBStack_1cb0;
  __int_type_conflict local_1ca8;
  __int_type_conflict _Stack_1ca0;
  float local_1c98;
  float fStack_1c94;
  float fStack_1c90;
  float fStack_1c8c;
  vuint<4> v0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c48;
  BBox1f local_1c38;
  longlong lStack_1c30;
  longlong local_1c28;
  longlong lStack_1c20;
  __pointer_type local_1c18;
  __pointer_type pBStack_1c10;
  __atomic_base<unsigned_long> local_1c08;
  longlong lStack_1c00;
  longlong local_1bf8;
  undefined8 uStack_1bf0;
  BBox1f local_1be8;
  pointer local_1bd8;
  undefined8 uStack_1bd0;
  longlong local_1bc8;
  longlong local_1bb8;
  longlong lStack_1bb0;
  longlong local_1ba8;
  longlong lStack_1ba0;
  anon_class_1_0_00000001 reduction;
  undefined1 local_1b78 [16];
  undefined1 local_1b68 [32];
  vuint<4> v1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b38;
  unsigned_long local_1b28;
  size_t sStack_1b20;
  size_t local_1b18;
  BBox1f BStack_1b10;
  BBox1f local_1b08;
  undefined8 uStack_1b00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1af8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ae8;
  __pointer_type local_1ad8;
  size_t sStack_1ad0;
  undefined1 local_1ac8 [16];
  BBox1f local_1ab8;
  BBox1f BStack_1ab0;
  BBox1f local_1aa8;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  longlong local_1a88;
  longlong local_1a78;
  longlong lStack_1a70;
  longlong local_1a68;
  longlong lStack_1a60;
  undefined1 local_1a58 [16];
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19e8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  BuildRecordSplit current;
  undefined1 local_17d8 [16];
  vuint<4> geomID;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17a8;
  undefined1 local_1798 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1788;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1768;
  __pointer_type local_1758 [2];
  undefined1 local_1748 [16];
  BBox1f local_1738;
  float fStack_1730;
  float fStack_172c;
  BBox1f local_1728 [2];
  Split local_1718 [57];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  undefined8 local_838 [14];
  BBox1f aBStack_7c8 [49];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar35 = in->depth;
  local_1e10 = __return_storage_ptr__;
  if ((this->cfg).maxDepth < uVar35) {
    puVar25 = (undefined8 *)__cxa_allocate_exception(0x30);
    geomID.field_0.v[0] = (longlong)&local_17b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&geomID,"depth limit reached","");
    *puVar25 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar25 + 1) = 1;
    puVar25[2] = puVar25 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar25 + 2),geomID.field_0.v[0],
               CONCAT44(geomID.field_0.i[3],geomID.field_0.i[2]) + geomID.field_0.v[0]);
    __cxa_throw(puVar25,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  local_1e28 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds0.lower.field_0;
  local_1e48 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds0.upper.field_0;
  local_1e88 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.lower.field_0.m128;
  local_1e68 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.upper.field_0.m128;
  local_1e38 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                centBounds.lower.field_0.m128;
  uVar55 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
             upper.field_0;
  uVar14 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    centBounds.upper.field_0 + 8);
  pBVar50 = (__pointer_type)(in->prims).super_PrimInfoMB.object_range._begin;
  pBVar4 = (__pointer_type)(in->prims).super_PrimInfoMB.object_range._end;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  BVar28 = (BBox1f)(in->prims).prims;
  uVar37 = &geomID;
  findFallback((Split *)uVar37,this,&in->prims);
  local_1718[0].mapping.num = local_17b8._0_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.lower.field_0 = local_1e28;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0 = local_1e48;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.lower.field_0 = local_1e88;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.upper.field_0 = local_1e68;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0 = local_1e38;
  current.super_BuildRecord.prims.super_PrimInfoMB.num_time_segments = values[0].ref.ptr;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_num_time_segments = values[0]._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar5 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  current.split.sah = (float)geomID.field_0._0_4_;
  current.split.dim = geomID.field_0._4_4_;
  current.split.mapping.num = local_17b8._0_8_;
  local_1718[0].mapping.ofs.field_0._0_8_ = local_17a8._0_8_;
  local_1718[0].mapping.ofs.field_0._8_8_ = local_17a8._8_8_;
  current.split.mapping.ofs.field_0._0_8_ = local_17a8._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = local_17a8._8_8_;
  local_1718[0].mapping.scale.field_0._0_8_ = local_1798._0_8_;
  local_1718[0].mapping.scale.field_0._8_8_ = local_1798._8_8_;
  current.split.mapping.scale.field_0._0_8_ = local_1798._0_8_;
  current.split.mapping.scale.field_0._8_8_ = local_1798._8_8_;
  uVar49 = (long)pBVar4 - (long)pBVar50;
  if (uVar49 == 0 || uVar35 != 1) {
    bVar15 = false;
  }
  else {
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
         (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
         (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar27 = (long)pBVar4 - (long)pBVar50;
    if (pBVar4 < pBVar50 || lVar27 == 0) {
      fVar79 = INFINITY;
      fVar84 = -INFINITY;
    }
    else {
      pfVar29 = &(*(PrimRefMB **)((long)BVar28 + 0x20))[(long)pBVar50].time_range.upper;
      auVar62._0_12_ = ZEXT812(0x7f800000);
      auVar62._12_4_ = 0;
      fVar83 = -INFINITY;
      do {
        if (((BBox1f *)(pfVar29 + -1))->lower <= auVar62._0_4_) {
          auVar62._0_4_ = ((BBox1f *)(pfVar29 + -1))->lower;
        }
        fVar79 = auVar62._0_4_;
        fVar84 = *pfVar29;
        if (*pfVar29 <= fVar83) {
          fVar84 = fVar83;
        }
        pfVar29 = pfVar29 + 0x14;
        lVar27 = lVar27 + -1;
        fVar83 = fVar84;
      } while (lVar27 != 0);
    }
    bVar15 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower < fVar79 ||
             fVar84 < current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  }
  current.super_BuildRecord.depth = uVar35;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0._0_8_ = uVar55;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0._8_8_ = uVar14;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin = (unsigned_long)pBVar50;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end = (unsigned_long)pBVar4;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range = BVar5;
  current.super_BuildRecord.prims.prims = (PrimRefVector)BVar28;
  if (((uVar49 <= (this->cfg).maxLeafSize) && ((uint)geomID.field_0._12_4_ < 2)) && (!bVar15)) {
    uVar35 = uVar49 + 3 >> 2;
    v1.field_0.v[0] = uVar35 * 0x60;
    pTVar7 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar7->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar7;
      MutexSys::lock(&pTVar7->mutex);
      if ((pTVar7->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar7->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar7->alloc1).bytesUsed + (pTVar7->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar7->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar7->alloc0).end + (pTVar7->alloc1).end) -
             ((pTVar7->alloc0).cur + (pTVar7->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar7->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar7->alloc1).bytesWasted + (pTVar7->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar7->alloc0).bytesUsed = 0;
      (pTVar7->alloc0).bytesWasted = 0;
      (pTVar7->alloc0).end = 0;
      (pTVar7->alloc0).allocBlockSize = 0;
      (pTVar7->alloc0).ptr = (char *)0x0;
      (pTVar7->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar7->alloc1).bytesUsed = 0;
        (pTVar7->alloc1).bytesWasted = 0;
        (pTVar7->alloc1).end = 0;
        (pTVar7->alloc1).allocBlockSize = 0;
        (pTVar7->alloc1).ptr = (char *)0x0;
        (pTVar7->alloc1).cur = 0;
      }
      else {
        (pTVar7->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar7->alloc1).ptr = (char *)0x0;
        (pTVar7->alloc1).cur = 0;
        (pTVar7->alloc1).end = 0;
        (pTVar7->alloc1).allocBlockSize = 0;
        (pTVar7->alloc1).bytesUsed = 0;
        (pTVar7->alloc1).bytesWasted = 0;
        (pTVar7->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar7->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      geomID.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      geomID.field_0.v[1]._0_1_ = 1;
      v0.field_0.v[0] = (longlong)pTVar7;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar8._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar8,(ThreadLocal2 **)&v0);
      }
      else {
        *iVar8._M_current = (ThreadLocal2 *)v0.field_0.v[0];
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    uVar37 = v1.field_0.v[0];
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + v1.field_0.v[0];
    sVar24 = (alloc.talloc1)->cur;
    uVar39 = (ulong)(-(int)sVar24 & 0xf);
    uVar32 = sVar24 + v1.field_0.v[0] + uVar39;
    (alloc.talloc1)->cur = uVar32;
    if ((alloc.talloc1)->end < uVar32) {
      (alloc.talloc1)->cur = sVar24;
      uVar39 = (alloc.talloc1)->allocBlockSize;
      if ((ulong)(v1.field_0.v[0] * 4) < uVar39 || v1.field_0.v[0] * 4 - uVar39 == 0) {
        geomID.field_0.v[0] = uVar39;
        pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
        (alloc.talloc1)->ptr = pcVar34;
        sVar24 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar24;
        (alloc.talloc1)->end = geomID.field_0.v[0];
        (alloc.talloc1)->cur = uVar37;
        if ((ulong)geomID.field_0.v[0] < (ulong)uVar37) {
          (alloc.talloc1)->cur = 0;
          geomID.field_0.v[0] = (alloc.talloc1)->allocBlockSize;
          pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
          (alloc.talloc1)->ptr = pcVar34;
          sVar24 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar24;
          (alloc.talloc1)->end = geomID.field_0.v[0];
          (alloc.talloc1)->cur = uVar37;
          if ((ulong)geomID.field_0.v[0] < (ulong)uVar37) {
            (alloc.talloc1)->cur = 0;
            pcVar34 = (char *)0x0;
            goto LAB_00c58a99;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar24;
      }
      else {
        pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v1);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar39;
      pcVar34 = (alloc.talloc1)->ptr + (uVar32 - v1.field_0._0_8_);
    }
LAB_00c58a99:
    uVar39 = 7;
    if (uVar35 < 7) {
      uVar39 = uVar35;
    }
    local_17d8 = _DAT_01f7a9f0;
    if (uVar49 + 3 < 4) {
      local_1b78 = _DAT_01f7a9f0;
      local_1db8._8_8_ = 0xff800000ff800000;
      local_1db8._0_8_ = 0xff800000ff800000;
      local_1b68._8_8_ = 0xff800000ff800000;
      local_1b68._0_8_ = 0xff800000ff800000;
    }
    else {
      lVar27 = 0;
      local_1b68._8_8_ = 0xff800000ff800000;
      local_1b68._0_8_ = 0xff800000ff800000;
      local_1b78 = _DAT_01f7a9f0;
      local_1db8._8_8_ = 0xff800000ff800000;
      local_1db8._0_8_ = 0xff800000ff800000;
      pBVar93 = this;
      do {
        BVar28 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
        pPVar10 = (current.super_BuildRecord.prims.prims)->items;
        local_1e70 = ((this->createLeaf).bvh)->scene;
        geomID.field_0.v[0] = -1;
        geomID.field_0.i[2] = 0xffffffff;
        geomID.field_0.i[3] = 0xffffffff;
        values[0].ref.ptr = 0xffffffffffffffff;
        values[0]._8_8_ = 0xffffffffffffffff;
        pPVar33 = pPVar10 + (long)pBVar50;
        v0.field_0.v[0] = 0;
        v0.field_0.v[1] = 0;
        v1.field_0.v[0] = 0;
        v1.field_0.v[1] = 0;
        v2.field_0.v[0] = 0;
        v2.field_0.v[1] = 0;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0;
        lVar21 = 0;
        do {
          if (pBVar50 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end) {
            fVar84 = (pPVar33->lbounds).bounds0.lower.field_0.m128[3];
            *(float *)((long)&geomID.field_0 + lVar21) = fVar84;
            fVar79 = (pPVar33->lbounds).bounds0.upper.field_0.m128[3];
            *(float *)((long)&values[0].ref.ptr + lVar21) = fVar79;
            pGVar11 = (local_1e70->geometries).items[(uint)fVar84].ptr;
            lVar40 = (ulong)(uint)fVar79 *
                     pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
            lVar22 = *(long *)&pGVar11->field_0x58;
            uVar36 = *(uint *)&pGVar11[1].intersectionFilterN >> 2;
            *(uint *)((long)&v0.field_0 + lVar21) = *(int *)(lVar22 + lVar40) * uVar36;
            *(uint *)((long)&v1.field_0 + lVar21) = *(int *)(lVar22 + 4 + lVar40) * uVar36;
            *(uint *)((long)&v2.field_0 + lVar21) = *(int *)(lVar22 + 8 + lVar40) * uVar36;
            *(uint *)((long)&right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .lower.field_0 + lVar21) = uVar36 * *(int *)(lVar22 + 0xc + lVar40);
            pBVar50 = (__pointer_type)
                      ((long)&(pBVar50->cur).super___atomic_base<unsigned_long>._M_i + 1);
          }
          else if (lVar21 != 0) {
            *(uint *)((long)&geomID.field_0 + lVar21) = geomID.field_0.i[0];
            *(undefined4 *)((long)&values[0].ref.ptr + lVar21) = 0xffffffff;
            uVar52 = v0.field_0.i[0];
            *(uint *)((long)&v0.field_0 + lVar21) = v0.field_0.i[0];
            *(undefined4 *)((long)&v1.field_0 + lVar21) = uVar52;
            *(undefined4 *)((long)&v2.field_0 + lVar21) = uVar52;
            *(undefined4 *)
             ((long)&right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0 + lVar21) = uVar52;
          }
          if (pBVar50 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end) {
            pPVar33 = pPVar10 + (long)pBVar50;
          }
          lVar21 = lVar21 + 4;
        } while (lVar21 != 0x10);
        lVar21 = lVar27 * 0x60;
        local_1e50 = (BBox1f)(pcVar34 + lVar21);
        *(longlong *)(pcVar34 + lVar21) = v0.field_0.v[0];
        *(longlong *)((long)(pcVar34 + lVar21) + 8) = v0.field_0.v[1];
        *(longlong *)(pcVar34 + lVar21 + 0x10) = v1.field_0.v[0];
        *(longlong *)((long)(pcVar34 + lVar21 + 0x10) + 8) = v1.field_0.v[1];
        *(longlong *)(pcVar34 + lVar21 + 0x20) = v2.field_0.v[0];
        *(longlong *)((long)(pcVar34 + lVar21 + 0x20) + 8) = v2.field_0.v[1];
        *(undefined8 *)(pcVar34 + lVar21 + 0x30) =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        *(undefined8 *)(pcVar34 + lVar21 + 0x30 + 8) =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        *(longlong *)(pcVar34 + lVar21 + 0x40) = geomID.field_0.v[0];
        *(longlong *)((long)(pcVar34 + lVar21 + 0x40) + 8) =
             CONCAT44(geomID.field_0.i[3],geomID.field_0.i[2]);
        *(size_t *)(pcVar34 + lVar21 + 0x50) = values[0].ref.ptr;
        *(undefined8 *)((long)(pcVar34 + lVar21 + 0x50) + 8) = values[0]._8_8_;
        local_1b68._20_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
        lVar21 = 0;
        local_1e88 = (anon_union_16_2_47237d3f_for_Vec3fa_0)_DAT_01f7a9f0;
        local_1e38 = (anon_union_16_2_47237d3f_for_Vec3fa_0)_DAT_01f7a9f0;
        local_1e68 = (anon_union_16_2_47237d3f_for_Vec3fa_0)_DAT_01f7aa00;
        auVar62 = _DAT_01f7aa00;
        do {
          uVar36 = *(uint *)((long)local_1e50 + lVar21 * 4 + 0x50);
          if ((ulong)uVar36 == 0xffffffff) break;
          pGVar11 = (local_1e70->geometries).items[*(uint *)((long)local_1e50 + lVar21 * 4 + 0x40)].
                    ptr;
          fVar84 = pGVar11->fnumTimeSegments;
          fVar79 = (pGVar11->time_range).lower;
          local_1b68._16_4_ = BVar28.lower;
          fVar90 = (pGVar11->time_range).upper - fVar79;
          fVar83 = ((float)local_1b68._16_4_ - fVar79) / fVar90;
          fVar90 = ((float)local_1b68._20_4_ - fVar79) / fVar90;
          local_1e28.m128[0] = fVar84;
          local_1e00 = (__atomic_base<unsigned_long> *)CONCAT44(local_1e00._4_4_,fVar83);
          fVar83 = fVar84 * fVar83;
          local_1a58 = ZEXT416((uint)fVar83);
          local_1e08 = (undefined1 (*) [16])CONCAT44(local_1e08._4_4_,fVar90);
          local_1e48.m128[0] = fVar84 * fVar90;
          fVar84 = floorf(fVar83);
          this = pBVar93;
          fVar79 = ceilf((float)local_1e48._0_4_);
          iVar20 = (int)fVar84;
          if (fVar84 <= 0.0) {
            fVar84 = 0.0;
          }
          uVar52 = fVar79;
          if ((float)local_1e28._0_4_ <= fVar79) {
            uVar52 = local_1e28._0_4_;
          }
          if (iVar20 < 0) {
            iVar20 = -1;
          }
          uVar13 = (int)(float)local_1e28._0_4_ + 1U;
          if ((int)fVar79 < (int)((int)(float)local_1e28._0_4_ + 1U)) {
            uVar13 = (int)fVar79;
          }
          lVar22 = *(long *)&pGVar11->field_0x58;
          lVar48 = (ulong)uVar36 *
                   pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          uVar49 = (ulong)*(uint *)(lVar22 + lVar48);
          uVar32 = (ulong)*(uint *)(lVar22 + 4 + lVar48);
          lVar40 = *(long *)&pGVar11[2].numPrimitives;
          lVar43 = (long)(int)fVar84 * 0x38;
          lVar12 = *(long *)(lVar40 + lVar43);
          lVar44 = *(long *)(lVar40 + 0x10 + lVar43);
          auVar82 = *(undefined1 (*) [16])(lVar12 + lVar44 * uVar49);
          auVar74 = *(undefined1 (*) [16])(lVar12 + lVar44 * uVar32);
          uVar38 = (ulong)*(uint *)(lVar22 + 8 + lVar48);
          auVar77 = *(undefined1 (*) [16])(lVar12 + lVar44 * uVar38);
          uVar41 = (ulong)*(uint *)(lVar22 + 0xc + lVar48);
          auVar81 = *(undefined1 (*) [16])(lVar12 + lVar44 * uVar41);
          auVar86 = minps(auVar82,auVar74);
          auVar68 = minps(auVar77,auVar81);
          auVar86 = minps(auVar86,auVar68);
          auVar74 = maxps(auVar82,auVar74);
          auVar82 = maxps(auVar77,auVar81);
          auVar60 = maxps(auVar74,auVar82);
          lVar44 = (long)(int)(float)uVar52 * 0x38;
          lVar22 = *(long *)(lVar40 + lVar44);
          lVar12 = *(long *)(lVar40 + 0x10 + lVar44);
          auVar82 = *(undefined1 (*) [16])(lVar22 + lVar12 * uVar49);
          auVar74 = *(undefined1 (*) [16])(lVar22 + lVar12 * uVar32);
          auVar77 = *(undefined1 (*) [16])(lVar22 + lVar12 * uVar38);
          auVar81 = *(undefined1 (*) [16])(lVar22 + lVar12 * uVar41);
          auVar68 = minps(auVar82,auVar74);
          auVar78 = minps(auVar77,auVar81);
          auVar68 = minps(auVar68,auVar78);
          auVar74 = maxps(auVar82,auVar74);
          auVar82 = maxps(auVar77,auVar81);
          auVar82 = maxps(auVar74,auVar82);
          fVar84 = (float)local_1a58._0_4_ - fVar84;
          fVar89 = auVar68._0_4_;
          fVar79 = auVar86._0_4_;
          fVar75 = auVar82._0_4_;
          fVar69 = auVar82._4_4_;
          fVar70 = auVar82._8_4_;
          fVar72 = auVar82._12_4_;
          fVar65 = auVar60._0_4_;
          fVar66 = auVar60._4_4_;
          fVar67 = auVar60._8_4_;
          fVar71 = auVar60._12_4_;
          fVar83 = auVar86._4_4_;
          fVar90 = auVar86._8_4_;
          fVar88 = auVar86._12_4_;
          fVar91 = auVar68._4_4_;
          fVar92 = auVar68._8_4_;
          fVar59 = auVar68._12_4_;
          if (uVar13 - iVar20 == 1) {
            if (fVar84 <= 0.0) {
              fVar84 = 0.0;
            }
            fVar56 = 1.0 - fVar84;
            auVar53._4_4_ = fVar56 * fVar83 + fVar84 * fVar91;
            auVar53._0_4_ = fVar56 * fVar79 + fVar84 * fVar89;
            auVar58._0_4_ = fVar56 * fVar65 + fVar84 * fVar75;
            auVar58._4_4_ = fVar56 * fVar66 + fVar84 * fVar69;
            auVar58._8_4_ = fVar56 * fVar67 + fVar84 * fVar70;
            auVar58._12_4_ = fVar56 * fVar71 + fVar84 * fVar72;
            fVar57 = (float)uVar52 - (float)local_1e48._0_4_;
            if ((float)uVar52 - (float)local_1e48._0_4_ <= 0.0) {
              fVar57 = 0.0;
            }
            fVar63 = 1.0 - fVar57;
            auVar54._0_4_ = fVar89 * fVar63 + fVar79 * fVar57;
            auVar54._4_4_ = fVar91 * fVar63 + fVar83 * fVar57;
            auVar54._8_4_ = fVar92 * fVar63 + fVar90 * fVar57;
            auVar54._12_4_ = fVar59 * fVar63 + fVar88 * fVar57;
            auVar64._0_4_ = fVar63 * fVar75 + fVar57 * fVar65;
            auVar64._4_4_ = fVar63 * fVar69 + fVar57 * fVar66;
            auVar64._8_4_ = fVar63 * fVar70 + fVar57 * fVar67;
            auVar64._12_4_ = fVar63 * fVar72 + fVar57 * fVar71;
            auVar53._8_4_ = fVar56 * fVar90 + fVar84 * fVar92;
            auVar53._12_4_ = fVar56 * fVar88 + fVar84 * fVar59;
          }
          else {
            lVar22 = *(long *)(lVar43 + lVar40 + 0x38);
            lVar12 = *(long *)(lVar43 + lVar40 + 0x48);
            auVar82 = *(undefined1 (*) [16])(lVar22 + lVar12 * uVar49);
            auVar74 = *(undefined1 (*) [16])(lVar22 + lVar12 * uVar32);
            auVar77 = *(undefined1 (*) [16])(lVar22 + lVar12 * uVar38);
            auVar81 = *(undefined1 (*) [16])(lVar22 + lVar12 * uVar41);
            auVar86 = minps(auVar82,auVar74);
            auVar68 = minps(auVar77,auVar81);
            auVar68 = minps(auVar86,auVar68);
            auVar82 = maxps(auVar82,auVar74);
            auVar74 = maxps(auVar77,auVar81);
            auVar86 = maxps(auVar82,auVar74);
            lVar22 = *(long *)(lVar44 + lVar40 + -0x38);
            lVar12 = *(long *)(lVar44 + lVar40 + -0x28);
            auVar82 = *(undefined1 (*) [16])(lVar22 + lVar12 * uVar49);
            auVar74 = *(undefined1 (*) [16])(lVar22 + lVar12 * uVar32);
            auVar77 = *(undefined1 (*) [16])(lVar22 + lVar12 * uVar38);
            auVar81 = *(undefined1 (*) [16])(lVar22 + lVar12 * uVar41);
            auVar60 = minps(auVar82,auVar74);
            auVar78 = minps(auVar77,auVar81);
            auVar60 = minps(auVar60,auVar78);
            auVar82 = maxps(auVar82,auVar74);
            auVar74 = maxps(auVar77,auVar81);
            auVar82 = maxps(auVar82,auVar74);
            if (fVar84 <= 0.0) {
              fVar84 = 0.0;
            }
            fVar57 = 1.0 - fVar84;
            auVar53._0_4_ = fVar79 * fVar57 + auVar68._0_4_ * fVar84;
            auVar53._4_4_ = fVar83 * fVar57 + auVar68._4_4_ * fVar84;
            auVar53._8_4_ = fVar90 * fVar57 + auVar68._8_4_ * fVar84;
            auVar53._12_4_ = fVar88 * fVar57 + auVar68._12_4_ * fVar84;
            auVar58._0_4_ = fVar57 * fVar65 + fVar84 * auVar86._0_4_;
            auVar58._4_4_ = fVar57 * fVar66 + fVar84 * auVar86._4_4_;
            auVar58._8_4_ = fVar57 * fVar67 + fVar84 * auVar86._8_4_;
            auVar58._12_4_ = fVar57 * fVar71 + fVar84 * auVar86._12_4_;
            fVar84 = (float)uVar52 - (float)local_1e48._0_4_;
            if ((float)uVar52 - (float)local_1e48._0_4_ <= 0.0) {
              fVar84 = 0.0;
            }
            fVar79 = 1.0 - fVar84;
            auVar54._0_4_ = fVar89 * fVar79 + auVar60._0_4_ * fVar84;
            auVar54._4_4_ = fVar91 * fVar79 + auVar60._4_4_ * fVar84;
            auVar54._8_4_ = fVar92 * fVar79 + auVar60._8_4_ * fVar84;
            auVar54._12_4_ = fVar59 * fVar79 + auVar60._12_4_ * fVar84;
            auVar64._0_4_ = fVar79 * fVar75 + fVar84 * auVar82._0_4_;
            auVar64._4_4_ = fVar79 * fVar69 + fVar84 * auVar82._4_4_;
            auVar64._8_4_ = fVar79 * fVar70 + fVar84 * auVar82._8_4_;
            auVar64._12_4_ = fVar79 * fVar72 + fVar84 * auVar82._12_4_;
            uVar36 = iVar20 + 1;
            if ((int)uVar36 < (int)uVar13) {
              plVar42 = (long *)(lVar40 + (ulong)uVar36 * 0x38 + 0x10);
              do {
                fVar59 = ((float)(int)uVar36 / (float)local_1e28._0_4_ - local_1e00._0_4_) /
                         (local_1e08._0_4_ - local_1e00._0_4_);
                fVar84 = 1.0 - fVar59;
                fVar90 = auVar54._4_4_;
                fVar88 = auVar54._12_4_;
                fVar71 = auVar54._8_4_;
                fVar79 = auVar53._4_4_;
                fVar83 = auVar53._12_4_;
                fVar75 = auVar53._8_4_;
                fVar65 = auVar64._4_4_;
                fVar66 = auVar64._8_4_;
                fVar67 = auVar64._12_4_;
                fVar89 = auVar58._4_4_;
                fVar91 = auVar58._8_4_;
                fVar92 = auVar58._12_4_;
                lVar22 = plVar42[-2];
                lVar40 = *plVar42;
                auVar82 = *(undefined1 (*) [16])(lVar22 + lVar40 * uVar49);
                auVar74 = *(undefined1 (*) [16])(lVar22 + lVar40 * uVar32);
                auVar77 = *(undefined1 (*) [16])(lVar22 + lVar40 * uVar38);
                auVar81 = *(undefined1 (*) [16])(lVar22 + lVar40 * uVar41);
                auVar86 = minps(auVar82,auVar74);
                auVar68 = minps(auVar77,auVar81);
                auVar86 = minps(auVar86,auVar68);
                auVar87._0_4_ = auVar86._0_4_ - (auVar53._0_4_ * fVar84 + auVar54._0_4_ * fVar59);
                auVar87._4_4_ = auVar86._4_4_ - (fVar79 * fVar84 + fVar90 * fVar59);
                auVar87._8_4_ = auVar86._8_4_ - (fVar75 * fVar84 + fVar71 * fVar59);
                auVar87._12_4_ = auVar86._12_4_ - (fVar83 * fVar84 + fVar88 * fVar59);
                auVar82 = maxps(auVar82,auVar74);
                auVar74 = maxps(auVar77,auVar81);
                auVar82 = maxps(auVar82,auVar74);
                auVar61._0_4_ = auVar82._0_4_ - (fVar84 * auVar58._0_4_ + fVar59 * auVar64._0_4_);
                auVar61._4_4_ = auVar82._4_4_ - (fVar84 * fVar89 + fVar59 * fVar65);
                auVar61._8_4_ = auVar82._8_4_ - (fVar84 * fVar91 + fVar59 * fVar66);
                auVar61._12_4_ = auVar82._12_4_ - (fVar84 * fVar92 + fVar59 * fVar67);
                auVar82 = minps(auVar87,ZEXT816(0));
                auVar53._0_4_ = auVar53._0_4_ + auVar82._0_4_;
                auVar53._4_4_ = fVar79 + auVar82._4_4_;
                auVar53._8_4_ = fVar75 + auVar82._8_4_;
                auVar53._12_4_ = fVar83 + auVar82._12_4_;
                auVar54._0_4_ = auVar54._0_4_ + auVar82._0_4_;
                auVar54._4_4_ = fVar90 + auVar82._4_4_;
                auVar54._8_4_ = fVar71 + auVar82._8_4_;
                auVar54._12_4_ = fVar88 + auVar82._12_4_;
                auVar82 = maxps(auVar61,ZEXT816(0));
                auVar58._0_4_ = auVar58._0_4_ + auVar82._0_4_;
                auVar58._4_4_ = fVar89 + auVar82._4_4_;
                auVar58._8_4_ = fVar91 + auVar82._8_4_;
                auVar58._12_4_ = fVar92 + auVar82._12_4_;
                auVar64._0_4_ = auVar64._0_4_ + auVar82._0_4_;
                auVar64._4_4_ = fVar65 + auVar82._4_4_;
                auVar64._8_4_ = fVar66 + auVar82._8_4_;
                auVar64._12_4_ = fVar67 + auVar82._12_4_;
                uVar36 = uVar36 + 1;
                plVar42 = plVar42 + 7;
              } while (uVar13 != uVar36);
            }
          }
          local_1e88.m128 = (__m128)minps(local_1e88.m128,auVar53);
          local_1e68.m128 = (__m128)maxps(local_1e68.m128,auVar58);
          local_1e38.m128 = (__m128)minps(local_1e38.m128,auVar54);
          auVar62 = maxps(auVar62,auVar64);
          lVar21 = lVar21 + 1;
          pBVar93 = this;
        } while (lVar21 != 4);
        local_1b68._0_16_ = maxps(local_1b68._0_16_,auVar62);
        local_1b78 = minps(local_1b78,(undefined1  [16])local_1e38);
        local_1db8 = maxps(local_1db8,(undefined1  [16])local_1e68);
        local_17d8 = minps(local_17d8,(undefined1  [16])local_1e88);
        lVar27 = lVar27 + 1;
      } while (lVar27 != uVar35 + (uVar35 == 0));
    }
    (local_1e10->ref).ptr = uVar39 | (ulong)pcVar34 | 8;
    *(undefined1 (*) [16])(local_1e10->lbounds).bounds0.lower.field_0.m128 = local_17d8;
    *(undefined8 *)&(local_1e10->lbounds).bounds0.upper.field_0 = local_1db8._0_8_;
    *(undefined8 *)((long)&(local_1e10->lbounds).bounds0.upper.field_0 + 8) = local_1db8._8_8_;
    *(undefined8 *)&(local_1e10->lbounds).bounds1.lower.field_0 = local_1b78._0_8_;
    *(undefined8 *)((long)&(local_1e10->lbounds).bounds1.lower.field_0 + 8) = local_1b78._8_8_;
    *(undefined8 *)&(local_1e10->lbounds).bounds1.upper.field_0 = local_1b68._0_8_;
    *(undefined8 *)((long)&(local_1e10->lbounds).bounds1.upper.field_0 + 8) = local_1b68._8_8_;
    local_1e10->dt = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
    return local_1e10;
  }
  lVar27 = 0xbc;
  do {
    *(undefined8 *)(local_17d8 + lVar27 + 4) = 0xffffffff7f800000;
    *(undefined8 *)(local_17d8 + lVar27 + 0xc) = 0;
    lVar27 = lVar27 + 0xf0;
  } while (lVar27 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  local_17b8 = local_1e28;
  local_17a8 = local_1e48;
  local_1798 = (undefined1  [16])local_1e88;
  local_1788 = local_1e68;
  local_1778 = local_1e38;
  local_1748._8_8_ = values[0]._8_8_;
  local_1748._0_8_ = values[0].ref.ptr;
  local_1758[0] = pBVar50;
  local_1758[1] = pBVar4;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  fStack_172c = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar28;
  local_1718[0].sah = (float)geomID.field_0._0_4_;
  local_1718[0].dim = geomID.field_0._4_4_;
  local_840 = BVar28;
  local_838[0] = 2;
  local_8c8[0] = &local_840;
  local_1e68._0_8_ = &local_1bd8;
  local_1e38._0_8_ = &local_1a98;
  local_1e70 = (Scene *)&this->heuristicTemporalSplit;
  local_1e00 = &local_1c08;
  local_1e08 = &local_1ac8;
  local_1e48._8_8_ = 0x7f8000007f800000;
  local_1e48._0_8_ = 0x7f8000007f800000;
  local_1e28._8_8_ = 0xff800000ff800000;
  local_1e28._0_8_ = 0xff800000ff800000;
  uVar49 = 0;
  geomID.field_0.v[0] = uVar35;
  local_1768._0_8_ = uVar55;
  local_1768._8_8_ = uVar14;
  do {
    if (local_848 == 0) goto LAB_00c58062;
    lVar27 = -1;
    ppBVar30 = local_1758;
    uVar35 = 0;
    uVar37 = 0;
    do {
      uVar39 = (long)ppBVar30[1] - (long)*ppBVar30;
      if ((((this->cfg).maxLeafSize < uVar39) || (1 < *(uint *)((long)ppBVar30 + 0x4c))) || (bVar15)
         ) {
        if (uVar35 < uVar39) {
          lVar27 = uVar37;
          uVar35 = uVar39;
        }
        bVar15 = false;
      }
      uVar37 = uVar37 + 1;
      ppBVar30 = ppBVar30 + 0x1e;
    } while (local_848 != uVar37);
    if (lVar27 == -1) goto LAB_00c58018;
    lVar21 = lVar27 * 0xf0;
    v0.field_0.v[0] = current.super_BuildRecord.depth + 1;
    local_1bd8 = (pointer)0xffffffff7f800000;
    uStack_1bd0 = 0;
    local_1a98 = 0xffffffff7f800000;
    uStack_1a90 = 0;
    pSVar3 = (Split *)((long)local_1718 + lVar21);
    iVar20 = *(int *)((long)local_1718 + lVar21 + 0xc);
    local_1e88._0_8_ = &(&geomID)[lVar27 * 0xf].field_0;
    local_1a58._0_8_ = uVar49;
    v1.field_0.v[0] = v0.field_0.v[0];
    if (iVar20 == 0) {
      pBVar50 = local_1758[lVar27 * 0x1e];
      sVar24 = *(size_t *)(local_1748 + lVar21 + -8);
      v2.field_0.v[0] = 0x7f8000007f800000;
      v2.field_0.v[1] = 0x7f8000007f800000;
      local_1d08._0_8_ = -0x7fffff00800000;
      local_1d08._8_8_ = -0x7fffff00800000;
      local_1cf8._0_8_ = 0x7f8000007f800000;
      local_1cf8._8_8_ = 0x7f8000007f800000;
      local_1ce8._0_8_ = -0x7fffff00800000;
      local_1ce8._8_8_ = -0x7fffff00800000;
      local_1cd8.m128[0] = INFINITY;
      local_1cd8.m128[1] = INFINITY;
      local_1cd8._8_8_ = 0x7f8000007f800000;
      local_1cc8._0_8_ = -0x7fffff00800000;
      local_1cc8._8_8_ = -0x7fffff00800000;
      local_1c98 = 0.0;
      local_1ca8 = 0;
      _Stack_1ca0 = 0;
      local_1cb8 = (__pointer_type)0x0;
      pBStack_1cb0 = (__pointer_type)0x0;
      fStack_1c94 = 1.0;
      fStack_1c90 = 1.0;
      fStack_1c8c = 0.0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.max_time_range.lower = 0.0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.max_time_range.upper = 1.0;
      right.time_range.lower = 1.0;
      right.time_range.upper = 0.0;
      vSplitPos.field_0.i[1] = *(undefined4 *)((long)local_1718 + lVar21 + 8);
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar22 = (long)(1 << (*(byte *)((long)local_1718 + lVar21 + 4) & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar22);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar22 + 8);
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      isLeft.split = pSVar3;
      pBStack_1c10 = (__pointer_type)
                     parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                               (*(PrimRefMB **)((long)local_1728[lVar27 * 0x1e] + 0x20),
                                (size_t)pBVar50,sVar24,(EmptyTy *)local_19e8,
                                (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&v2,&right,&isLeft,
                                &reduction,&reduction2,0x80,0xc00);
      BVar5 = local_1728[lVar27 * 0x1e];
      BVar28 = local_1728[lVar27 * 0x1e + -1];
      local_1c48._8_8_ = 0xff800000ff800000;
      local_1c48._0_8_ = 0xff800000ff800000;
      local_1c78._0_8_ = v2.field_0.v[0];
      local_1c78._8_8_ = v2.field_0.v[1];
      local_1c68._0_8_ = -0x7fffff00800000;
      local_1c68._8_8_ = -0x7fffff00800000;
      local_1c58._0_8_ = 0x7f8000007f800000;
      local_1c58._8_8_ = 0x7f8000007f800000;
      local_1c38.lower = INFINITY;
      local_1c38.upper = INFINITY;
      lStack_1c30 = 0x7f8000007f800000;
      local_1c28 = -0x7fffff00800000;
      lStack_1c20 = -0x7fffff00800000;
      local_1e00[2]._M_i = 0x3f80000000000000;
      local_1e00[3]._M_i = (__int_type_conflict)&DAT_3f800000;
      local_1e00->_M_i = 0;
      local_1e00[1]._M_i = 0;
      fVar79 = BVar28.lower;
      fVar84 = fVar79;
      if (fVar79 <= (float)uStack_1bf0) {
        fVar84 = (float)uStack_1bf0;
      }
      fVar83 = BVar28.upper;
      if (fVar83 <= uStack_1bf0._4_4_) {
        uStack_1bf0._4_4_ = fVar83;
      }
      uStack_1bf0 = CONCAT44(uStack_1bf0._4_4_,fVar84);
      local_1b38._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      local_1b38._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      local_1b28 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                   field_0._0_8_;
      sStack_1b20 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._8_8_;
      local_1b18 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                   field_0._0_8_;
      BStack_1b10.lower =
           (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0._8_4_;
      BStack_1b10.upper =
           (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0._12_4_;
      local_1b08.lower =
           (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0._0_4_;
      local_1b08.upper =
           (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0._4_4_;
      uStack_1b00 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0._8_8_;
      local_1af8._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_;
      local_1af8._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_;
      local_1ae8._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_;
      local_1ae8._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_;
      *(ulong *)local_1e08[1] = CONCAT44(right.max_time_range.upper,right.max_time_range.lower);
      *(ulong *)(local_1e08[1] + 8) = CONCAT44(right.time_range.upper,right.time_range.lower);
      *(size_t *)*local_1e08 = right.num_time_segments;
      *(size_t *)(*local_1e08 + 8) = right.max_num_time_segments;
      if (fVar79 <= BStack_1ab0.lower) {
        BVar28 = (BBox1f)((ulong)BStack_1ab0 & 0xffffffff);
      }
      if (fVar83 <= BStack_1ab0.upper) {
        BStack_1ab0.upper = fVar83;
      }
      BStack_1ab0.lower = BVar28.lower;
      pBVar93 = this;
      local_1c18 = pBVar50;
      local_1be8 = BVar5;
      local_1ad8 = pBStack_1c10;
      sStack_1ad0 = sVar24;
      local_1aa8 = BVar5;
LAB_00c572ed:
      local_1e90.lower = 0.0;
      local_1e90.upper = 0.0;
      bVar51 = false;
    }
    else {
      this_00 = &local_17b8 + lVar27 * 0xf;
      if (iVar20 != 2) {
        if (iVar20 == 1) {
          SetMB::deterministic_order((SetMB *)&this_00->field_1);
          splitFallback(this,(SetMB *)&this_00->field_1,(SetMB *)&local_1c78.field_1,
                        (SetMB *)&local_1b38.field_1);
          pBVar93 = this;
        }
        else {
          pBVar93 = this;
          if (iVar20 == 3) {
            SetMB::deterministic_order((SetMB *)&this_00->field_1);
            splitByGeometry(this,(SetMB *)&this_00->field_1,(SetMB *)&local_1c78.field_1,
                            (SetMB *)&local_1b38.field_1);
            pBVar93 = this;
          }
        }
        goto LAB_00c572ed;
      }
      time_range1.lower = *(float *)((long)local_1718 + lVar21 + 8);
      time_range0.lower = local_1728[lVar27 * 0x1e + -1].lower;
      time_range1.upper = local_1728[lVar27 * 0x1e + -1].upper;
      local_1e50 = local_1728[lVar27 * 0x1e];
      time_range0.upper = time_range1.lower;
      BVar28 = (BBox1f)operator_new(0x28);
      pMVar6 = *(MemoryMonitorInterface **)&local_1e70->super_AccelN;
      pSVar31 = *(Split **)(local_1748 + lVar21 + -8);
      *(MemoryMonitorInterface **)BVar28 = pMVar6;
      *(undefined1 *)((long)BVar28 + 8) = 0;
      *(long *)((long)BVar28 + 0x10) = 0;
      *(long *)((long)BVar28 + 0x18) = 0;
      *(long *)((long)BVar28 + 0x20) = 0;
      lVar22 = (long)pSVar31 - (long)local_1758[lVar27 * 0x1e];
      pSVar45 = pSVar31;
      pBVar93 = this;
      if (lVar22 != 0) {
        uVar35 = lVar22 * 0x50;
        (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,uVar35,0);
        if (uVar35 < 0x1c00000) {
          pvVar23 = alignedMalloc(uVar35,0x10);
        }
        else {
          pvVar23 = os_malloc(uVar35,(bool *)((long)BVar28 + 8));
        }
        *(void **)((long)BVar28 + 0x20) = pvVar23;
        *(long *)((long)BVar28 + 0x10) = lVar22;
        *(long *)((long)BVar28 + 0x18) = lVar22;
        pSVar31 = *(Split **)(local_1e88._0_8_ + 0x70);
        pSVar45 = *(Split **)(local_1e88._0_8_ + 0x78);
        pBVar93 = this;
      }
      pvVar16 = isLeft.vSplitPos;
      vSplitMask.field_0._0_4_ = local_1e50.lower;
      vSplitMask.field_0._4_4_ = local_1e50.upper;
      vSplitMask.field_0._8_8_ = &time_range0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.max_time_range.lower = 0.0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.max_time_range.upper = 1.0;
      right.time_range.lower = 1.0;
      right.time_range.upper = 0.0;
      local_1e90 = BVar28;
      if ((ulong)((long)pSVar45 - (long)pSVar31) < 0xc00) {
        isLeft.split = pSVar31;
        isLeft.vSplitPos = (vint *)pSVar45;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  ((PrimInfoMB *)&v2,(anon_class_40_5_808acc65 *)&vSplitMask,
                   (range<unsigned_long> *)&isLeft);
      }
      else {
        isLeft.vSplitPos._6_2_ = SUB82(pvVar16,6);
        isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
        tbb::detail::r1::initialize((task_group_context *)&isLeft);
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)pSVar45;
        vSplitPos.field_0.v[1] = (longlong)pSVar31;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMB *)&v2,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,(task_group_context *)pBVar93);
        cVar19 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar19 != '\0') {
          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar26,"task cancelled");
          __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&isLeft);
      }
      lVar22 = *(long *)(local_1e88._0_8_ + 0x70);
      pcVar46 = *(code **)(local_1e88._0_8_ + 0x78);
      uVar35 = (long)pcVar46 - lVar22;
      if ((long)pBStack_1cb0 - (long)local_1cb8 != uVar35) {
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = &time_range0;
        pBStack_1cb0 = (__pointer_type)
                       parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                 (*(PrimRefMB **)((long)BVar28 + 0x20),0,uVar35,0x400,
                                  (anon_class_8_1_41ce32a5 *)&right);
        lVar22 = *(long *)(local_1e88._0_8_ + 0x70);
        pcVar46 = *(code **)(local_1e88._0_8_ + 0x78);
        uVar35 = (long)pcVar46 - lVar22;
      }
      local_1e00->_M_i = local_1ca8;
      local_1e00[1]._M_i = _Stack_1ca0;
      uVar37 = vSplitPos.field_0.v[1];
      local_1c78._0_8_ = v2.field_0.v[0];
      local_1c78._8_8_ = v2.field_0.v[1];
      local_1c68._0_8_ = local_1d08._0_8_;
      local_1c68._8_8_ = local_1d08._8_8_;
      local_1c58._0_8_ = local_1cf8._0_8_;
      local_1c58._8_8_ = local_1cf8._8_8_;
      local_1c48._8_8_ = local_1ce8._8_8_;
      local_1c48._0_8_ = local_1ce8._0_8_;
      local_1c38.lower = local_1cd8.m128[0];
      local_1c38.upper = local_1cd8.m128[1];
      lStack_1c30 = local_1cd8._8_8_;
      local_1c28 = local_1cc8._0_8_;
      lStack_1c20 = local_1cc8._8_8_;
      local_1c18 = local_1cb8;
      local_1bf8 = CONCAT44(fStack_1c94,local_1c98);
      uStack_1bf0 = CONCAT44(~-(uint)(fStack_1c8c < time_range0.upper) & (uint)time_range0.upper,
                             ~-(uint)(fStack_1c90 < time_range0.lower) & (uint)fStack_1c90) |
                    CONCAT44((uint)fStack_1c8c & -(uint)(fStack_1c8c < time_range0.upper),
                             (uint)time_range0.lower & -(uint)(fStack_1c90 < time_range0.lower));
      _reduction2 = local_1e50;
      isLeft.split = (Split *)0x7f8000007f800000;
      isLeft.vSplitPos = (vint *)0x7f8000007f800000;
      isLeft.vSplitMask = (vbool *)0xff800000ff800000;
      pBStack_1c10 = pBStack_1cb0;
      local_1be8 = BVar28;
      if (uVar35 < 0xc00) {
        vSplitPos.field_0.v[0] = lVar22;
        vSplitPos.field_0.v[1] = (longlong)pcVar46;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  (&right,(anon_class_24_3_35f68c7c *)&reduction2,(range<unsigned_long> *)&vSplitPos
                  );
      }
      else {
        vSplitPos.field_0.v[1]._4_1_ = 1;
        vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar37,6);
        vSplitPos.field_0.v[1]._5_1_ = 4;
        tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
        local_19e8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_19e8._8_8_ = &reduction2;
        _reduction = pcVar46;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19e8,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,(task_group_context *)pBVar93);
        cVar19 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar19 != '\0') {
          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar26,"task cancelled");
          __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
      }
      lVar22 = right.object_range._end - right.object_range._begin;
      right.object_range._begin = *(unsigned_long *)(local_1e88._0_8_ + 0x70);
      right.object_range._end = lVar22 + right.object_range._begin;
      if (lVar22 != *(unsigned_long *)(local_1e88._0_8_ + 0x78) - right.object_range._begin) {
        isLeft.split = (Split *)&time_range1;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                       (*(PrimRefMB **)((long)local_1e50 + 0x20),right.object_range._begin,
                        *(unsigned_long *)(local_1e88._0_8_ + 0x78),0x400,
                        (anon_class_8_1_41ce32a6 *)&isLeft);
      }
      local_1b38._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      local_1b38._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      local_1b28 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                   field_0._0_8_;
      sStack_1b20 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._8_8_;
      local_1b18 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                   field_0._0_8_;
      BStack_1b10.lower =
           (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0._8_4_;
      BStack_1b10.upper =
           (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0._12_4_;
      local_1b08.lower =
           (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0._0_4_;
      local_1b08.upper =
           (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0._4_4_;
      uStack_1b00 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0._8_8_;
      local_1af8._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_;
      local_1af8._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_;
      local_1ae8._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_;
      local_1ae8._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_;
      auVar82._8_8_ = right.max_num_time_segments;
      auVar82._0_8_ = right.num_time_segments;
      *local_1e08 = auVar82;
      local_1ab8.upper = right.max_time_range.upper;
      local_1ab8.lower = right.max_time_range.lower;
      BStack_1ab0 = (BBox1f)(CONCAT44(~-(uint)(right.time_range.upper < time_range1.upper) &
                                      (uint)time_range1.upper,
                                      ~-(uint)(right.time_range.lower < time_range1.lower) &
                                      (uint)right.time_range.lower) |
                            CONCAT44((uint)right.time_range.upper &
                                     -(uint)(right.time_range.upper < time_range1.upper),
                                     (uint)time_range1.lower &
                                     -(uint)(right.time_range.lower < time_range1.lower)));
      local_1aa8 = local_1e50;
      bVar51 = local_1e90 != (BBox1f)0x0;
      local_1ad8 = (__pointer_type)right.object_range._begin;
      sStack_1ad0 = right.object_range._end;
    }
    uVar37 = &v2;
    this = pBVar93;
    findFallback((Split *)uVar37,pBVar93,(SetMB *)&local_1c78.field_1);
    *(longlong *)local_1e68._0_8_ = v2.field_0.v[0];
    *(longlong *)(local_1e68._0_8_ + 8) = v2.field_0.v[1];
    local_1bc8 = local_1d08._0_8_;
    local_1bb8 = local_1cf8._0_8_;
    lStack_1bb0 = local_1cf8._8_8_;
    local_1ba8 = local_1ce8._0_8_;
    lStack_1ba0 = local_1ce8._8_8_;
    findFallback((Split *)uVar37,pBVar93,(SetMB *)&local_1b38.field_1);
    lVar22 = local_640;
    *(longlong *)local_1e38._0_8_ = v2.field_0.v[0];
    *(longlong *)(local_1e38._0_8_ + 8) = v2.field_0.v[1];
    local_1a88 = local_1d08._0_8_;
    local_1a78 = local_1cf8._0_8_;
    lStack_1a70 = local_1cf8._8_8_;
    local_1a68 = local_1ce8._0_8_;
    lStack_1a60 = local_1ce8._8_8_;
    local_1e90 = (BBox1f)0x0;
    pBVar47 = local_8c8[lVar27];
    if (local_1be8 == *pBVar47) {
      pBVar47[1] = (BBox1f)((long)pBVar47[1] + 1);
      BVar28 = local_1be8;
    }
    else {
      local_640 = local_640 + 1;
      uVar37 = &local_840;
      *(BBox1f *)
       ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
         *)(uVar37 + 0x78) + (lVar22 * 2 + -0xf) * 8) = local_1be8;
      local_838[lVar22 * 2] = 1;
      local_8c8[lVar27] =
           (BBox1f *)
           ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
             *)(uVar37 + 0x78) + (lVar22 * 2 + -0xf) * 8);
      BVar28 = *pBVar47;
    }
    lVar27 = local_640;
    if (local_1aa8 == BVar28) {
      local_8c8[local_848] = pBVar47;
      BVar28 = pBVar47[1];
      pBVar47[1] = (BBox1f)((long)BVar28 + 1);
    }
    else {
      local_640 = local_640 + 1;
      uVar37 = &local_840;
      *(BBox1f *)
       ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
         *)(uVar37 + 0x78) + (lVar27 * 2 + -0xf) * 8) = local_1aa8;
      local_838[lVar27 * 2] = 1;
      local_8c8[local_848] =
           (BBox1f *)
           ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
             *)(uVar37 + 0x78) + (lVar27 * 2 + -0xf) * 8);
      BVar28 = (BBox1f)((long)pBVar47[1] + -1);
    }
    pBVar47[1] = BVar28;
    if (BVar28 == (BBox1f)0x0) {
      uVar37 = *pBVar47;
      if ((BBox1f)uVar37 != (BBox1f)0x0) {
        lVar27 = *(long *)(uVar37 + 0x18);
        pvVar23 = *(void **)&((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                               *)(uVar37 + 0x20))->field_0x0;
        if (pvVar23 != (void *)0x0) {
          if ((ulong)(lVar27 * 0x50) < 0x1c00000) {
            alignedFree(pvVar23);
          }
          else {
            os_free(pvVar23,lVar27 * 0x50,
                    (bool)*(default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                            *)(uVar37 + 8));
          }
        }
        if (lVar27 != 0) {
          (**(code **)**(undefined8 **)uVar37)(*(undefined8 **)uVar37,lVar27 * -0x50,1);
        }
        *(undefined8 *)
         &((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)(uVar37 + 0x10))->field_0x0 = 0;
        *(undefined8 *)(uVar37 + 0x18) = 0;
        *(undefined8 *)
         &((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)(uVar37 + 0x20))->field_0x0 = 0;
      }
      operator_delete((void *)uVar37);
    }
    *(longlong *)local_1e88._0_8_ = v0.field_0.v[0];
    *(undefined8 *)(local_1e88._0_8_ + 0x10) = local_1c78._0_8_;
    *(undefined8 *)(local_1e88._0_8_ + 0x18) = local_1c78._8_8_;
    *(undefined8 *)(local_1e88._0_8_ + 0x20) = local_1c68._0_8_;
    *(undefined8 *)(local_1e88._0_8_ + 0x28) = local_1c68._8_8_;
    *(undefined8 *)(local_1e88._0_8_ + 0x30) = local_1c58._0_8_;
    *(undefined8 *)(local_1e88._0_8_ + 0x38) = local_1c58._8_8_;
    *(undefined8 *)(local_1e88._0_8_ + 0x40) = local_1c48._0_8_;
    *(undefined8 *)(local_1e88._0_8_ + 0x48) = local_1c48._8_8_;
    *(BBox1f *)(local_1e88._0_8_ + 0x50) = local_1c38;
    *(longlong *)(local_1e88._0_8_ + 0x58) = lStack_1c30;
    *(longlong *)(local_1e88._0_8_ + 0x60) = local_1c28;
    *(longlong *)(local_1e88._0_8_ + 0x68) = lStack_1c20;
    *(__pointer_type *)(local_1e88._0_8_ + 0x70) = local_1c18;
    *(__pointer_type *)(local_1e88._0_8_ + 0x78) = pBStack_1c10;
    *(__int_type_conflict *)(local_1e88._0_8_ + 0x80) = local_1c08._M_i;
    *(longlong *)(local_1e88._0_8_ + 0x88) = lStack_1c00;
    *(longlong *)(local_1e88._0_8_ + 0x90) = local_1bf8;
    *(ulong *)(local_1e88._0_8_ + 0x98) = uStack_1bf0;
    *(BBox1f *)(local_1e88._0_8_ + 0xa0) = local_1be8;
    uVar55 = *(undefined8 *)local_1e68._0_8_;
    uVar14 = *(undefined8 *)(local_1e68._0_8_ + 8);
    pSVar3->sah = (float)(int)uVar55;
    pSVar3->dim = (int)((ulong)uVar55 >> 0x20);
    *(undefined8 *)((long)local_1718 + lVar21 + 8) = uVar14;
    uVar35 = local_848;
    *(longlong *)(local_1e88._0_8_ + 0xc0) = local_1bc8;
    *(longlong *)(local_1e88._0_8_ + 0xd0) = local_1bb8;
    *(longlong *)(local_1e88._0_8_ + 0xd8) = lStack_1bb0;
    *(longlong *)(local_1e88._0_8_ + 0xe0) = local_1ba8;
    *(longlong *)(local_1e88._0_8_ + 0xe8) = lStack_1ba0;
    lVar27 = local_848 * 0xf0;
    (&geomID)[local_848 * 0xf].field_0.v[0] = v1.field_0.v[0];
    *(undefined8 *)(&local_17b8 + uVar35 * 0xf) = local_1b38._0_8_;
    *(undefined8 *)((long)&local_17b8 + lVar27 + 8) = local_1b38._8_8_;
    *(unsigned_long *)((long)&local_17a8 + uVar35 * 0xf0) = local_1b28;
    *(size_t *)(local_1798 + lVar27 + -8) = sStack_1b20;
    *(size_t *)(local_1798 + uVar35 * 0xf0) = local_1b18;
    *(BBox1f *)(local_1798 + lVar27 + 8) = BStack_1b10;
    *(BBox1f *)(&local_1788 + uVar35 * 0xf) = local_1b08;
    *(undefined8 *)((long)&local_1788 + lVar27 + 8) = uStack_1b00;
    *(undefined8 *)((long)&local_1778 + uVar35 * 0xf0) = local_1af8._0_8_;
    *(undefined8 *)((long)&local_1778 + uVar35 * 0xf0 + 8) = local_1af8._8_8_;
    *(undefined8 *)(&local_1768 + uVar35 * 0xf) = local_1ae8._0_8_;
    *(undefined8 *)((long)&local_1768 + uVar35 * 0xf0 + 8) = local_1ae8._8_8_;
    local_1758[uVar35 * 0x1e] = local_1ad8;
    *(size_t *)(local_1748 + lVar27 + -8) = sStack_1ad0;
    *(undefined8 *)(local_1748 + lVar27) = local_1ac8._0_8_;
    *(undefined8 *)(local_1748 + lVar27 + 8) = local_1ac8._8_8_;
    (&local_1738)[uVar35 * 0x1e] = local_1ab8;
    local_1728[uVar35 * 0x1e + -1] = BStack_1ab0;
    local_1728[uVar35 * 0x1e] = local_1aa8;
    uVar55 = *(undefined8 *)(local_1e38._0_8_ + 8);
    *(undefined8 *)((long)local_1718 + lVar27) = *(undefined8 *)local_1e38._0_8_;
    *(undefined8 *)((long)local_1718 + lVar27 + 8) = uVar55;
    *(longlong *)((long)local_1718 + uVar35 * 0xf0 + 0x10) = local_1a88;
    *(longlong *)((long)local_1718 + uVar35 * 0xf0 + 0x20) = local_1a78;
    *(longlong *)((long)local_1718 + (uVar35 * 0x1e + 1) * 8 + 0x20) = lStack_1a70;
    *(longlong *)((long)local_1718 + (uVar35 * 0x1e + 2) * 8 + 0x20) = local_1a68;
    *(longlong *)((long)local_1718 + (uVar35 * 0x1e + 3) * 8 + 0x20) = lStack_1a60;
    local_848 = local_848 + 1;
    if (local_1e90 != (BBox1f)0x0) {
      uVar37 = &local_1e90;
      std::
      default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
      ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                    *)uVar37,
                   (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                    *)local_1e90);
    }
    uVar49 = CONCAT71(local_1a58._1_7_,local_1a58[0] | bVar51);
  } while (local_848 < (this->cfg).branchingFactor);
  if (local_848 != 0) {
LAB_00c58018:
    pfVar29 = &fStack_172c;
    uVar35 = local_848;
    do {
      uVar49 = (ulong)(byte)((byte)uVar49 |
                            -(*pfVar29 < (in->prims).super_PrimInfoMB.time_range.upper ||
                             (in->prims).super_PrimInfoMB.time_range.lower < pfVar29[-1]));
      pfVar29 = pfVar29 + 0x3c;
      uVar35 = uVar35 - 1;
    } while (uVar35 != 0);
  }
LAB_00c58062:
  if ((uVar49 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar7 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar7->alloc)._M_b._M_p) {
      v1.field_0.v[1]._0_1_ = 1;
      v1.field_0.v[0] = (longlong)pTVar7;
      MutexSys::lock(&pTVar7->mutex);
      if ((pTVar7->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar7->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar7->alloc1).bytesUsed + (pTVar7->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar7->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar7->alloc0).end + (pTVar7->alloc1).end) -
             ((pTVar7->alloc0).cur + (pTVar7->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar7->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar7->alloc1).bytesWasted + (pTVar7->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar7->alloc0).bytesUsed = 0;
      (pTVar7->alloc0).bytesWasted = 0;
      (pTVar7->alloc0).end = 0;
      (pTVar7->alloc0).allocBlockSize = 0;
      (pTVar7->alloc0).ptr = (char *)0x0;
      (pTVar7->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar7->alloc1).bytesUsed = 0;
        (pTVar7->alloc1).bytesWasted = 0;
        (pTVar7->alloc1).end = 0;
        (pTVar7->alloc1).allocBlockSize = 0;
        (pTVar7->alloc1).ptr = (char *)0x0;
        (pTVar7->alloc1).cur = 0;
      }
      else {
        (pTVar7->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar7->alloc1).ptr = (char *)0x0;
        (pTVar7->alloc1).cur = 0;
        (pTVar7->alloc1).end = 0;
        (pTVar7->alloc1).allocBlockSize = 0;
        (pTVar7->alloc1).bytesUsed = 0;
        (pTVar7->alloc1).bytesWasted = 0;
        (pTVar7->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar7->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      v0.field_0.v[1]._0_1_ = 1;
      v2.field_0.v[0] = (longlong)pTVar7;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar8._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar8,(ThreadLocal2 **)&v2);
      }
      else {
        *iVar8._M_current = (ThreadLocal2 *)v2.field_0.v[0];
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (v1.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)v1.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar24 = (alloc.talloc0)->cur;
    uVar35 = (ulong)(-(int)sVar24 & 0xf);
    uVar49 = sVar24 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar35;
    (alloc.talloc0)->cur = uVar49;
    if ((alloc.talloc0)->end < uVar49) {
      (alloc.talloc0)->cur = sVar24;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc0)->ptr = pcVar34;
        sVar24 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar24;
        (alloc.talloc0)->end = v0.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v0.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
          pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
          (alloc.talloc0)->ptr = pcVar34;
          sVar24 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar24;
          (alloc.talloc0)->end = v0.field_0.v[0];
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)v0.field_0.v[0] <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar34 = (char *)0x0;
            goto LAB_00c5846b;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar24;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar35;
      pcVar34 = (alloc.talloc0)->ptr +
                (uVar49 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_00c5846b:
    pcVar34[0x60] = '\0';
    pcVar34[0x61] = '\0';
    pcVar34[0x62] = -0x80;
    pcVar34[99] = '\x7f';
    pcVar34[100] = '\0';
    pcVar34[0x65] = '\0';
    pcVar34[0x66] = -0x80;
    pcVar34[0x67] = '\x7f';
    pcVar34[0x68] = '\0';
    pcVar34[0x69] = '\0';
    pcVar34[0x6a] = -0x80;
    pcVar34[0x6b] = '\x7f';
    pcVar34[0x6c] = '\0';
    pcVar34[0x6d] = '\0';
    pcVar34[0x6e] = -0x80;
    pcVar34[0x6f] = '\x7f';
    pcVar34[0x40] = '\0';
    pcVar34[0x41] = '\0';
    pcVar34[0x42] = -0x80;
    pcVar34[0x43] = '\x7f';
    pcVar34[0x44] = '\0';
    pcVar34[0x45] = '\0';
    pcVar34[0x46] = -0x80;
    pcVar34[0x47] = '\x7f';
    pcVar34[0x48] = '\0';
    pcVar34[0x49] = '\0';
    pcVar34[0x4a] = -0x80;
    pcVar34[0x4b] = '\x7f';
    pcVar34[0x4c] = '\0';
    pcVar34[0x4d] = '\0';
    pcVar34[0x4e] = -0x80;
    pcVar34[0x4f] = '\x7f';
    pcVar34[0x20] = '\0';
    pcVar34[0x21] = '\0';
    pcVar34[0x22] = -0x80;
    pcVar34[0x23] = '\x7f';
    pcVar34[0x24] = '\0';
    pcVar34[0x25] = '\0';
    pcVar34[0x26] = -0x80;
    pcVar34[0x27] = '\x7f';
    pcVar34[0x28] = '\0';
    pcVar34[0x29] = '\0';
    pcVar34[0x2a] = -0x80;
    pcVar34[0x2b] = '\x7f';
    pcVar34[0x2c] = '\0';
    pcVar34[0x2d] = '\0';
    pcVar34[0x2e] = -0x80;
    pcVar34[0x2f] = '\x7f';
    pcVar34[0x70] = '\0';
    pcVar34[0x71] = '\0';
    pcVar34[0x72] = -0x80;
    pcVar34[0x73] = -1;
    pcVar34[0x74] = '\0';
    pcVar34[0x75] = '\0';
    pcVar34[0x76] = -0x80;
    pcVar34[0x77] = -1;
    pcVar34[0x78] = '\0';
    pcVar34[0x79] = '\0';
    pcVar34[0x7a] = -0x80;
    pcVar34[0x7b] = -1;
    pcVar34[0x7c] = '\0';
    pcVar34[0x7d] = '\0';
    pcVar34[0x7e] = -0x80;
    pcVar34[0x7f] = -1;
    pcVar34[0x50] = '\0';
    pcVar34[0x51] = '\0';
    pcVar34[0x52] = -0x80;
    pcVar34[0x53] = -1;
    pcVar34[0x54] = '\0';
    pcVar34[0x55] = '\0';
    pcVar34[0x56] = -0x80;
    pcVar34[0x57] = -1;
    pcVar34[0x58] = '\0';
    pcVar34[0x59] = '\0';
    pcVar34[0x5a] = -0x80;
    pcVar34[0x5b] = -1;
    pcVar34[0x5c] = '\0';
    pcVar34[0x5d] = '\0';
    pcVar34[0x5e] = -0x80;
    pcVar34[0x5f] = -1;
    pcVar34[0x30] = '\0';
    pcVar34[0x31] = '\0';
    pcVar34[0x32] = -0x80;
    pcVar34[0x33] = -1;
    pcVar34[0x34] = '\0';
    pcVar34[0x35] = '\0';
    pcVar34[0x36] = -0x80;
    pcVar34[0x37] = -1;
    pcVar34[0x38] = '\0';
    pcVar34[0x39] = '\0';
    pcVar34[0x3a] = -0x80;
    pcVar34[0x3b] = -1;
    pcVar34[0x3c] = '\0';
    pcVar34[0x3d] = '\0';
    pcVar34[0x3e] = -0x80;
    pcVar34[0x3f] = -1;
    pcVar34[0x80] = '\0';
    pcVar34[0x81] = '\0';
    pcVar34[0x82] = '\0';
    pcVar34[0x83] = '\0';
    pcVar34[0x84] = '\0';
    pcVar34[0x85] = '\0';
    pcVar34[0x86] = '\0';
    pcVar34[0x87] = '\0';
    pcVar34[0x88] = '\0';
    pcVar34[0x89] = '\0';
    pcVar34[0x8a] = '\0';
    pcVar34[0x8b] = '\0';
    pcVar34[0x8c] = '\0';
    pcVar34[0x8d] = '\0';
    pcVar34[0x8e] = '\0';
    pcVar34[0x8f] = '\0';
    pcVar34[0x90] = '\0';
    pcVar34[0x91] = '\0';
    pcVar34[0x92] = '\0';
    pcVar34[0x93] = '\0';
    pcVar34[0x94] = '\0';
    pcVar34[0x95] = '\0';
    pcVar34[0x96] = '\0';
    pcVar34[0x97] = '\0';
    pcVar34[0x98] = '\0';
    pcVar34[0x99] = '\0';
    pcVar34[0x9a] = '\0';
    pcVar34[0x9b] = '\0';
    pcVar34[0x9c] = '\0';
    pcVar34[0x9d] = '\0';
    pcVar34[0x9e] = '\0';
    pcVar34[0x9f] = '\0';
    pcVar34[0xa0] = '\0';
    pcVar34[0xa1] = '\0';
    pcVar34[0xa2] = '\0';
    pcVar34[0xa3] = '\0';
    pcVar34[0xa4] = '\0';
    pcVar34[0xa5] = '\0';
    pcVar34[0xa6] = '\0';
    pcVar34[0xa7] = '\0';
    pcVar34[0xa8] = '\0';
    pcVar34[0xa9] = '\0';
    pcVar34[0xaa] = '\0';
    pcVar34[0xab] = '\0';
    pcVar34[0xac] = '\0';
    pcVar34[0xad] = '\0';
    pcVar34[0xae] = '\0';
    pcVar34[0xaf] = '\0';
    pcVar34[0xb0] = '\0';
    pcVar34[0xb1] = '\0';
    pcVar34[0xb2] = '\0';
    pcVar34[0xb3] = '\0';
    pcVar34[0xb4] = '\0';
    pcVar34[0xb5] = '\0';
    pcVar34[0xb6] = '\0';
    pcVar34[0xb7] = '\0';
    pcVar34[0xb8] = '\0';
    pcVar34[0xb9] = '\0';
    pcVar34[0xba] = '\0';
    pcVar34[0xbb] = '\0';
    pcVar34[0xbc] = '\0';
    pcVar34[0xbd] = '\0';
    pcVar34[0xbe] = '\0';
    pcVar34[0xbf] = '\0';
    pcVar34[0xc0] = '\0';
    pcVar34[0xc1] = '\0';
    pcVar34[0xc2] = '\0';
    pcVar34[0xc3] = '\0';
    pcVar34[0xc4] = '\0';
    pcVar34[0xc5] = '\0';
    pcVar34[0xc6] = '\0';
    pcVar34[199] = '\0';
    pcVar34[200] = '\0';
    pcVar34[0xc9] = '\0';
    pcVar34[0xca] = '\0';
    pcVar34[0xcb] = '\0';
    pcVar34[0xcc] = '\0';
    pcVar34[0xcd] = '\0';
    pcVar34[0xce] = '\0';
    pcVar34[0xcf] = '\0';
    pcVar34[0xd0] = '\0';
    pcVar34[0xd1] = '\0';
    pcVar34[0xd2] = '\0';
    pcVar34[0xd3] = '\0';
    pcVar34[0xd4] = '\0';
    pcVar34[0xd5] = '\0';
    pcVar34[0xd6] = '\0';
    pcVar34[0xd7] = '\0';
    pcVar34[0xd8] = '\0';
    pcVar34[0xd9] = '\0';
    pcVar34[0xda] = '\0';
    pcVar34[0xdb] = '\0';
    pcVar34[0xdc] = '\0';
    pcVar34[0xdd] = '\0';
    pcVar34[0xde] = '\0';
    pcVar34[0xdf] = '\0';
    pcVar34[0] = '\b';
    pcVar34[1] = '\0';
    pcVar34[2] = '\0';
    pcVar34[3] = '\0';
    pcVar34[4] = '\0';
    pcVar34[5] = '\0';
    pcVar34[6] = '\0';
    pcVar34[7] = '\0';
    pcVar34[8] = '\b';
    pcVar34[9] = '\0';
    pcVar34[10] = '\0';
    pcVar34[0xb] = '\0';
    pcVar34[0xc] = '\0';
    pcVar34[0xd] = '\0';
    pcVar34[0xe] = '\0';
    pcVar34[0xf] = '\0';
    pcVar34[0x10] = '\b';
    pcVar34[0x11] = '\0';
    pcVar34[0x12] = '\0';
    pcVar34[0x13] = '\0';
    pcVar34[0x14] = '\0';
    pcVar34[0x15] = '\0';
    pcVar34[0x16] = '\0';
    pcVar34[0x17] = '\0';
    pcVar34[0x18] = '\b';
    pcVar34[0x19] = '\0';
    pcVar34[0x1a] = '\0';
    pcVar34[0x1b] = '\0';
    pcVar34[0x1c] = '\0';
    pcVar34[0x1d] = '\0';
    pcVar34[0x1e] = '\0';
    pcVar34[0x1f] = '\0';
    uVar49 = 1;
    uVar35 = 0;
    goto LAB_00c584d4;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar7 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar7->alloc)._M_b._M_p) {
    v1.field_0.v[1]._0_1_ = 1;
    v1.field_0.v[0] = (longlong)pTVar7;
    MutexSys::lock(&pTVar7->mutex);
    if ((pTVar7->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar7->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar7->alloc1).bytesUsed + (pTVar7->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar7->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar7->alloc0).end + (pTVar7->alloc1).end) -
           ((pTVar7->alloc0).cur + (pTVar7->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar7->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar7->alloc1).bytesWasted + (pTVar7->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar7->alloc0).bytesUsed = 0;
    (pTVar7->alloc0).bytesWasted = 0;
    (pTVar7->alloc0).end = 0;
    (pTVar7->alloc0).allocBlockSize = 0;
    (pTVar7->alloc0).ptr = (char *)0x0;
    (pTVar7->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar7->alloc1).bytesUsed = 0;
      (pTVar7->alloc1).bytesWasted = 0;
      (pTVar7->alloc1).end = 0;
      (pTVar7->alloc1).allocBlockSize = 0;
      (pTVar7->alloc1).ptr = (char *)0x0;
      (pTVar7->alloc1).cur = 0;
    }
    else {
      (pTVar7->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar7->alloc1).ptr = (char *)0x0;
      (pTVar7->alloc1).cur = 0;
      (pTVar7->alloc1).end = 0;
      (pTVar7->alloc1).allocBlockSize = 0;
      (pTVar7->alloc1).bytesUsed = 0;
      (pTVar7->alloc1).bytesWasted = 0;
      (pTVar7->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar7->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    v0.field_0.v[1]._0_1_ = 1;
    v2.field_0.v[0] = (longlong)pTVar7;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar8._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar8,(ThreadLocal2 **)&v2);
    }
    else {
      *iVar8._M_current = (ThreadLocal2 *)v2.field_0.v[0];
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    uVar37 = &FastAllocator::s_thread_local_allocators_lock;
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (v1.field_0.v[1]._0_1_ == '\x01') {
      uVar37 = v1.field_0.v[0];
      MutexSys::unlock((MutexSys *)v1.field_0.v[0]);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar24 = (alloc.talloc0)->cur;
  uVar35 = (ulong)(-(int)sVar24 & 0xf);
  uVar49 = sVar24 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar35;
  (alloc.talloc0)->cur = uVar49;
  if ((alloc.talloc0)->end < uVar49) {
    (alloc.talloc0)->cur = sVar24;
    uVar37 = alloc.alloc;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
      pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
      (alloc.talloc0)->ptr = pcVar34;
      sVar24 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar24;
      (alloc.talloc0)->end = v0.field_0.v[0];
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)v0.field_0.v[0] <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        uVar37 = alloc.alloc;
        pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc0)->ptr = pcVar34;
        sVar24 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar24;
        (alloc.talloc0)->end = v0.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v0.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar34 = (char *)0x0;
          goto LAB_00c58372;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar24;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar35;
    pcVar34 = (alloc.talloc0)->ptr +
              (uVar49 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_00c58372:
  pcVar34[0xe0] = '\0';
  pcVar34[0xe1] = '\0';
  pcVar34[0xe2] = -0x80;
  pcVar34[0xe3] = '\x7f';
  pcVar34[0xe4] = '\0';
  pcVar34[0xe5] = '\0';
  pcVar34[0xe6] = -0x80;
  pcVar34[0xe7] = '\x7f';
  pcVar34[0xe8] = '\0';
  pcVar34[0xe9] = '\0';
  pcVar34[0xea] = -0x80;
  pcVar34[0xeb] = '\x7f';
  pcVar34[0xec] = '\0';
  pcVar34[0xed] = '\0';
  pcVar34[0xee] = -0x80;
  pcVar34[0xef] = '\x7f';
  pcVar34[0xf0] = '\0';
  pcVar34[0xf1] = '\0';
  pcVar34[0xf2] = -0x80;
  pcVar34[0xf3] = -1;
  pcVar34[0xf4] = '\0';
  pcVar34[0xf5] = '\0';
  pcVar34[0xf6] = -0x80;
  pcVar34[0xf7] = -1;
  pcVar34[0xf8] = '\0';
  pcVar34[0xf9] = '\0';
  pcVar34[0xfa] = -0x80;
  pcVar34[0xfb] = -1;
  pcVar34[0xfc] = '\0';
  pcVar34[0xfd] = '\0';
  pcVar34[0xfe] = -0x80;
  pcVar34[0xff] = -1;
  pcVar34[0x60] = '\0';
  pcVar34[0x61] = '\0';
  pcVar34[0x62] = -0x80;
  pcVar34[99] = '\x7f';
  pcVar34[100] = '\0';
  pcVar34[0x65] = '\0';
  pcVar34[0x66] = -0x80;
  pcVar34[0x67] = '\x7f';
  pcVar34[0x68] = '\0';
  pcVar34[0x69] = '\0';
  pcVar34[0x6a] = -0x80;
  pcVar34[0x6b] = '\x7f';
  pcVar34[0x6c] = '\0';
  pcVar34[0x6d] = '\0';
  pcVar34[0x6e] = -0x80;
  pcVar34[0x6f] = '\x7f';
  pcVar34[0x40] = '\0';
  pcVar34[0x41] = '\0';
  pcVar34[0x42] = -0x80;
  pcVar34[0x43] = '\x7f';
  pcVar34[0x44] = '\0';
  pcVar34[0x45] = '\0';
  pcVar34[0x46] = -0x80;
  pcVar34[0x47] = '\x7f';
  pcVar34[0x48] = '\0';
  pcVar34[0x49] = '\0';
  pcVar34[0x4a] = -0x80;
  pcVar34[0x4b] = '\x7f';
  pcVar34[0x4c] = '\0';
  pcVar34[0x4d] = '\0';
  pcVar34[0x4e] = -0x80;
  pcVar34[0x4f] = '\x7f';
  pcVar34[0x20] = '\0';
  pcVar34[0x21] = '\0';
  pcVar34[0x22] = -0x80;
  pcVar34[0x23] = '\x7f';
  pcVar34[0x24] = '\0';
  pcVar34[0x25] = '\0';
  pcVar34[0x26] = -0x80;
  pcVar34[0x27] = '\x7f';
  pcVar34[0x28] = '\0';
  pcVar34[0x29] = '\0';
  pcVar34[0x2a] = -0x80;
  pcVar34[0x2b] = '\x7f';
  pcVar34[0x2c] = '\0';
  pcVar34[0x2d] = '\0';
  pcVar34[0x2e] = -0x80;
  pcVar34[0x2f] = '\x7f';
  pcVar34[0x70] = '\0';
  pcVar34[0x71] = '\0';
  pcVar34[0x72] = -0x80;
  pcVar34[0x73] = -1;
  pcVar34[0x74] = '\0';
  pcVar34[0x75] = '\0';
  pcVar34[0x76] = -0x80;
  pcVar34[0x77] = -1;
  pcVar34[0x78] = '\0';
  pcVar34[0x79] = '\0';
  pcVar34[0x7a] = -0x80;
  pcVar34[0x7b] = -1;
  pcVar34[0x7c] = '\0';
  pcVar34[0x7d] = '\0';
  pcVar34[0x7e] = -0x80;
  pcVar34[0x7f] = -1;
  pcVar34[0x50] = '\0';
  pcVar34[0x51] = '\0';
  pcVar34[0x52] = -0x80;
  pcVar34[0x53] = -1;
  pcVar34[0x54] = '\0';
  pcVar34[0x55] = '\0';
  pcVar34[0x56] = -0x80;
  pcVar34[0x57] = -1;
  pcVar34[0x58] = '\0';
  pcVar34[0x59] = '\0';
  pcVar34[0x5a] = -0x80;
  pcVar34[0x5b] = -1;
  pcVar34[0x5c] = '\0';
  pcVar34[0x5d] = '\0';
  pcVar34[0x5e] = -0x80;
  pcVar34[0x5f] = -1;
  pcVar34[0x30] = '\0';
  pcVar34[0x31] = '\0';
  pcVar34[0x32] = -0x80;
  pcVar34[0x33] = -1;
  pcVar34[0x34] = '\0';
  pcVar34[0x35] = '\0';
  pcVar34[0x36] = -0x80;
  pcVar34[0x37] = -1;
  pcVar34[0x38] = '\0';
  pcVar34[0x39] = '\0';
  pcVar34[0x3a] = -0x80;
  pcVar34[0x3b] = -1;
  pcVar34[0x3c] = '\0';
  pcVar34[0x3d] = '\0';
  pcVar34[0x3e] = -0x80;
  pcVar34[0x3f] = -1;
  pcVar34[0x80] = '\0';
  pcVar34[0x81] = '\0';
  pcVar34[0x82] = '\0';
  pcVar34[0x83] = '\0';
  pcVar34[0x84] = '\0';
  pcVar34[0x85] = '\0';
  pcVar34[0x86] = '\0';
  pcVar34[0x87] = '\0';
  pcVar34[0x88] = '\0';
  pcVar34[0x89] = '\0';
  pcVar34[0x8a] = '\0';
  pcVar34[0x8b] = '\0';
  pcVar34[0x8c] = '\0';
  pcVar34[0x8d] = '\0';
  pcVar34[0x8e] = '\0';
  pcVar34[0x8f] = '\0';
  pcVar34[0x90] = '\0';
  pcVar34[0x91] = '\0';
  pcVar34[0x92] = '\0';
  pcVar34[0x93] = '\0';
  pcVar34[0x94] = '\0';
  pcVar34[0x95] = '\0';
  pcVar34[0x96] = '\0';
  pcVar34[0x97] = '\0';
  pcVar34[0x98] = '\0';
  pcVar34[0x99] = '\0';
  pcVar34[0x9a] = '\0';
  pcVar34[0x9b] = '\0';
  pcVar34[0x9c] = '\0';
  pcVar34[0x9d] = '\0';
  pcVar34[0x9e] = '\0';
  pcVar34[0x9f] = '\0';
  pcVar34[0xa0] = '\0';
  pcVar34[0xa1] = '\0';
  pcVar34[0xa2] = '\0';
  pcVar34[0xa3] = '\0';
  pcVar34[0xa4] = '\0';
  pcVar34[0xa5] = '\0';
  pcVar34[0xa6] = '\0';
  pcVar34[0xa7] = '\0';
  pcVar34[0xa8] = '\0';
  pcVar34[0xa9] = '\0';
  pcVar34[0xaa] = '\0';
  pcVar34[0xab] = '\0';
  pcVar34[0xac] = '\0';
  pcVar34[0xad] = '\0';
  pcVar34[0xae] = '\0';
  pcVar34[0xaf] = '\0';
  pcVar34[0xb0] = '\0';
  pcVar34[0xb1] = '\0';
  pcVar34[0xb2] = '\0';
  pcVar34[0xb3] = '\0';
  pcVar34[0xb4] = '\0';
  pcVar34[0xb5] = '\0';
  pcVar34[0xb6] = '\0';
  pcVar34[0xb7] = '\0';
  pcVar34[0xb8] = '\0';
  pcVar34[0xb9] = '\0';
  pcVar34[0xba] = '\0';
  pcVar34[0xbb] = '\0';
  pcVar34[0xbc] = '\0';
  pcVar34[0xbd] = '\0';
  pcVar34[0xbe] = '\0';
  pcVar34[0xbf] = '\0';
  pcVar34[0xc0] = '\0';
  pcVar34[0xc1] = '\0';
  pcVar34[0xc2] = '\0';
  pcVar34[0xc3] = '\0';
  pcVar34[0xc4] = '\0';
  pcVar34[0xc5] = '\0';
  pcVar34[0xc6] = '\0';
  pcVar34[199] = '\0';
  pcVar34[200] = '\0';
  pcVar34[0xc9] = '\0';
  pcVar34[0xca] = '\0';
  pcVar34[0xcb] = '\0';
  pcVar34[0xcc] = '\0';
  pcVar34[0xcd] = '\0';
  pcVar34[0xce] = '\0';
  pcVar34[0xcf] = '\0';
  pcVar34[0xd0] = '\0';
  pcVar34[0xd1] = '\0';
  pcVar34[0xd2] = '\0';
  pcVar34[0xd3] = '\0';
  pcVar34[0xd4] = '\0';
  pcVar34[0xd5] = '\0';
  pcVar34[0xd6] = '\0';
  pcVar34[0xd7] = '\0';
  pcVar34[0xd8] = '\0';
  pcVar34[0xd9] = '\0';
  pcVar34[0xda] = '\0';
  pcVar34[0xdb] = '\0';
  pcVar34[0xdc] = '\0';
  pcVar34[0xdd] = '\0';
  pcVar34[0xde] = '\0';
  pcVar34[0xdf] = '\0';
  pcVar34[0] = '\b';
  pcVar34[1] = '\0';
  pcVar34[2] = '\0';
  pcVar34[3] = '\0';
  pcVar34[4] = '\0';
  pcVar34[5] = '\0';
  pcVar34[6] = '\0';
  pcVar34[7] = '\0';
  pcVar34[8] = '\b';
  pcVar34[9] = '\0';
  pcVar34[10] = '\0';
  pcVar34[0xb] = '\0';
  pcVar34[0xc] = '\0';
  pcVar34[0xd] = '\0';
  pcVar34[0xe] = '\0';
  pcVar34[0xf] = '\0';
  pcVar34[0x10] = '\b';
  pcVar34[0x11] = '\0';
  pcVar34[0x12] = '\0';
  pcVar34[0x13] = '\0';
  pcVar34[0x14] = '\0';
  pcVar34[0x15] = '\0';
  pcVar34[0x16] = '\0';
  pcVar34[0x17] = '\0';
  pcVar34[0x18] = '\b';
  pcVar34[0x19] = '\0';
  pcVar34[0x1a] = '\0';
  pcVar34[0x1b] = '\0';
  pcVar34[0x1c] = '\0';
  pcVar34[0x1d] = '\0';
  pcVar34[0x1e] = '\0';
  pcVar34[0x1f] = '\0';
  uVar35 = CONCAT71(SUB87(uVar37,1),1);
  uVar49 = 6;
LAB_00c584d4:
  local_1e88._8_8_ = 0xff800000ff800000;
  local_1e88._0_8_ = 0xff800000ff800000;
  uVar37 = 0x7f8000007f800000;
  uVar55 = 0x7f8000007f800000;
  if (local_848 != 0) {
    local_1e38.m128[0] = (float)(int)uVar35;
    pBVar47 = &values[0].dt;
    uVar35 = 0;
    local_1e48._8_8_ = 0x7f8000007f800000;
    local_1e48._0_8_ = 0x7f8000007f800000;
    local_1e68._8_8_ = 0x7f8000007f800000;
    local_1e68._0_8_ = 0x7f8000007f800000;
    local_1e28._8_8_ = 0xff800000ff800000;
    local_1e28._0_8_ = 0xff800000ff800000;
    local_1e88._8_8_ = 0xff800000ff800000;
    local_1e88._0_8_ = 0xff800000ff800000;
    in_00 = (BuildRecord *)&geomID;
    do {
      createLargeLeaf((NodeRecordMB4D *)&v0,this,in_00,alloc);
      auVar82 = _DAT_01f80810;
      auVar62 = _DAT_01f80800;
      pBVar47[-10].lower = (float)v0.field_0.v[0]._0_4_;
      pBVar47[-10].upper = (float)v0.field_0._4_4_;
      auVar74._8_8_ = local_1c78._8_8_;
      auVar74._0_8_ = local_1c78._0_8_;
      *(undefined1 (*) [16])(pBVar47 + -8) = auVar74;
      auVar77._8_8_ = local_1c68._8_8_;
      auVar77._0_8_ = local_1c68._0_8_;
      *(undefined1 (*) [16])(pBVar47 + -6) = auVar77;
      auVar81._8_8_ = local_1c58._8_8_;
      auVar81._0_8_ = local_1c58._0_8_;
      *(undefined1 (*) [16])(pBVar47 + -4) = auVar81;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
       ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar47 + -2))->m128 = local_1c48;
      *pBVar47 = local_1c38;
      local_1e48.m128 = (__m128)minps(local_1e48.m128,auVar74);
      local_1e28.m128 = (__m128)maxps(local_1e28.m128,auVar77);
      local_1e68.m128 = (__m128)minps(local_1e68.m128,auVar81);
      local_1e88.m128 = (__m128)maxps(local_1e88.m128,local_1c48.m128);
      uVar35 = uVar35 + 1;
      pBVar47 = pBVar47 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (uVar35 < local_848);
    if (((uint)uVar49 | (uint)pcVar34 & 0xf) == 1) {
      if (local_848 != 0) {
        uVar35 = (ulong)pcVar34 & 0xfffffffffffffff0;
        pfVar29 = &values[0].dt.upper;
        lVar27 = 0;
        do {
          *(undefined8 *)(uVar35 + lVar27 * 8) = *(undefined8 *)(pfVar29 + -0x15);
          fVar84 = ((BBox1f *)(pfVar29 + -1))->lower;
          fVar83 = 1.0 / (*pfVar29 - fVar84);
          fVar90 = -fVar84 * fVar83;
          fVar79 = 1.0 - fVar90;
          auVar76._0_4_ = pfVar29[-0x11] * fVar79 + pfVar29[-9] * fVar90;
          auVar76._4_4_ = pfVar29[-0x10] * fVar79 + pfVar29[-8] * fVar90;
          auVar76._8_4_ = pfVar29[-0xf] * fVar79 + pfVar29[-7] * fVar90;
          auVar76._12_4_ = pfVar29[-0xe] * fVar79 + pfVar29[-6] * fVar90;
          auVar80._0_4_ = fVar79 * pfVar29[-0xd] + fVar90 * pfVar29[-5];
          auVar80._4_4_ = fVar79 * pfVar29[-0xc] + fVar90 * pfVar29[-4];
          auVar80._8_4_ = fVar79 * pfVar29[-0xb] + fVar90 * pfVar29[-3];
          auVar80._12_4_ = fVar79 * pfVar29[-10] + fVar90 * pfVar29[-2];
          fVar83 = (1.0 - fVar84) * fVar83;
          fVar84 = 1.0 - fVar83;
          auVar73._0_4_ = pfVar29[-0x11] * fVar84 + pfVar29[-9] * fVar83;
          auVar73._4_4_ = pfVar29[-0x10] * fVar84 + pfVar29[-8] * fVar83;
          auVar73._8_4_ = pfVar29[-0xf] * fVar84 + pfVar29[-7] * fVar83;
          auVar73._12_4_ = pfVar29[-0xe] * fVar84 + pfVar29[-6] * fVar83;
          auVar85._0_4_ = fVar84 * pfVar29[-0xd] + fVar83 * pfVar29[-5];
          auVar85._4_4_ = fVar84 * pfVar29[-0xc] + fVar83 * pfVar29[-4];
          auVar85._8_4_ = fVar84 * pfVar29[-0xb] + fVar83 * pfVar29[-3];
          auVar85._12_4_ = fVar84 * pfVar29[-10] + fVar83 * pfVar29[-2];
          auVar77 = minps(auVar76,auVar82);
          auVar81 = maxps(auVar80,auVar62);
          auVar74 = minps(auVar73,auVar82);
          auVar86 = maxps(auVar85,auVar62);
          fVar84 = auVar77._0_4_ - ABS(auVar77._0_4_) * 4.7683716e-07;
          fVar79 = auVar77._4_4_ - ABS(auVar77._4_4_) * 4.7683716e-07;
          fVar83 = auVar77._8_4_ - ABS(auVar77._8_4_) * 4.7683716e-07;
          fVar90 = ABS(auVar81._0_4_) * 4.7683716e-07 + auVar81._0_4_;
          fVar88 = ABS(auVar81._4_4_) * 4.7683716e-07 + auVar81._4_4_;
          fVar89 = ABS(auVar81._8_4_) * 4.7683716e-07 + auVar81._8_4_;
          *(float *)(uVar35 + 0x20 + lVar27 * 4) = fVar84;
          *(float *)(uVar35 + 0x40 + lVar27 * 4) = fVar79;
          *(float *)(uVar35 + 0x60 + lVar27 * 4) = fVar83;
          *(float *)(uVar35 + 0x30 + lVar27 * 4) = fVar90;
          *(float *)(uVar35 + 0x50 + lVar27 * 4) = fVar88;
          *(float *)(uVar35 + 0x70 + lVar27 * 4) = fVar89;
          *(float *)(uVar35 + 0x80 + lVar27 * 4) =
               (auVar74._0_4_ - ABS(auVar74._0_4_) * 4.7683716e-07) - fVar84;
          *(float *)(uVar35 + 0xa0 + lVar27 * 4) =
               (auVar74._4_4_ - ABS(auVar74._4_4_) * 4.7683716e-07) - fVar79;
          *(float *)(uVar35 + 0xc0 + lVar27 * 4) =
               (auVar74._8_4_ - ABS(auVar74._8_4_) * 4.7683716e-07) - fVar83;
          *(float *)(uVar35 + 0x90 + lVar27 * 4) =
               (ABS(auVar86._0_4_) * 4.7683716e-07 + auVar86._0_4_) - fVar90;
          *(float *)(uVar35 + 0xb0 + lVar27 * 4) =
               (ABS(auVar86._4_4_) * 4.7683716e-07 + auVar86._4_4_) - fVar88;
          *(float *)(uVar35 + 0xd0 + lVar27 * 4) =
               (ABS(auVar86._8_4_) * 4.7683716e-07 + auVar86._8_4_) - fVar89;
          lVar27 = lVar27 + 1;
          pfVar29 = pfVar29 + 0x18;
        } while (local_848 != lVar27);
      }
    }
    else if (local_848 != 0) {
      uVar35 = (ulong)pcVar34 & 0xfffffffffffffff0;
      pfVar29 = &values[0].dt.upper;
      lVar27 = 0;
      do {
        *(undefined8 *)(uVar35 + lVar27 * 8) = *(undefined8 *)(pfVar29 + -0x15);
        fVar84 = *pfVar29;
        fVar79 = ((BBox1f *)(pfVar29 + -1))->lower;
        fVar90 = 1.0 / (fVar84 - fVar79);
        fVar88 = -fVar79 * fVar90;
        fVar83 = 1.0 - fVar88;
        auVar68._0_4_ = pfVar29[-0x11] * fVar83 + pfVar29[-9] * fVar88;
        auVar68._4_4_ = pfVar29[-0x10] * fVar83 + pfVar29[-8] * fVar88;
        auVar68._8_4_ = pfVar29[-0xf] * fVar83 + pfVar29[-7] * fVar88;
        auVar68._12_4_ = pfVar29[-0xe] * fVar83 + pfVar29[-6] * fVar88;
        auVar60._0_4_ = fVar83 * pfVar29[-0xd] + fVar88 * pfVar29[-5];
        auVar60._4_4_ = fVar83 * pfVar29[-0xc] + fVar88 * pfVar29[-4];
        auVar60._8_4_ = fVar83 * pfVar29[-0xb] + fVar88 * pfVar29[-3];
        auVar60._12_4_ = fVar83 * pfVar29[-10] + fVar88 * pfVar29[-2];
        fVar90 = (1.0 - fVar79) * fVar90;
        fVar83 = 1.0 - fVar90;
        auVar86._0_4_ = pfVar29[-0x11] * fVar83 + pfVar29[-9] * fVar90;
        auVar86._4_4_ = pfVar29[-0x10] * fVar83 + pfVar29[-8] * fVar90;
        auVar86._8_4_ = pfVar29[-0xf] * fVar83 + pfVar29[-7] * fVar90;
        auVar86._12_4_ = pfVar29[-0xe] * fVar83 + pfVar29[-6] * fVar90;
        auVar78._0_4_ = fVar83 * pfVar29[-0xd] + fVar90 * pfVar29[-5];
        auVar78._4_4_ = fVar83 * pfVar29[-0xc] + fVar90 * pfVar29[-4];
        auVar78._8_4_ = fVar83 * pfVar29[-0xb] + fVar90 * pfVar29[-3];
        auVar78._12_4_ = fVar83 * pfVar29[-10] + fVar90 * pfVar29[-2];
        auVar74 = minps(auVar68,_DAT_01f80810);
        auVar77 = maxps(auVar60,auVar62);
        auVar82 = minps(auVar86,_DAT_01f80810);
        auVar81 = maxps(auVar78,auVar62);
        fVar89 = auVar74._0_4_ - ABS(auVar74._0_4_) * 4.7683716e-07;
        fVar91 = auVar74._4_4_ - ABS(auVar74._4_4_) * 4.7683716e-07;
        fVar92 = auVar74._8_4_ - ABS(auVar74._8_4_) * 4.7683716e-07;
        fVar83 = ABS(auVar77._0_4_) * 4.7683716e-07 + auVar77._0_4_;
        fVar90 = ABS(auVar77._4_4_) * 4.7683716e-07 + auVar77._4_4_;
        fVar88 = ABS(auVar77._8_4_) * 4.7683716e-07 + auVar77._8_4_;
        *(float *)(uVar35 + 0x20 + lVar27 * 4) = fVar89;
        *(float *)(uVar35 + 0x40 + lVar27 * 4) = fVar91;
        *(float *)(uVar35 + 0x60 + lVar27 * 4) = fVar92;
        *(float *)(uVar35 + 0x30 + lVar27 * 4) = fVar83;
        *(float *)(uVar35 + 0x50 + lVar27 * 4) = fVar90;
        *(float *)(uVar35 + 0x70 + lVar27 * 4) = fVar88;
        *(float *)(uVar35 + 0x80 + lVar27 * 4) =
             (auVar82._0_4_ - ABS(auVar82._0_4_) * 4.7683716e-07) - fVar89;
        *(float *)(uVar35 + 0xa0 + lVar27 * 4) =
             (auVar82._4_4_ - ABS(auVar82._4_4_) * 4.7683716e-07) - fVar91;
        *(float *)(uVar35 + 0xc0 + lVar27 * 4) =
             (auVar82._8_4_ - ABS(auVar82._8_4_) * 4.7683716e-07) - fVar92;
        *(float *)(uVar35 + 0x90 + lVar27 * 4) =
             (ABS(auVar81._0_4_) * 4.7683716e-07 + auVar81._0_4_) - fVar83;
        *(float *)(uVar35 + 0xb0 + lVar27 * 4) =
             (ABS(auVar81._4_4_) * 4.7683716e-07 + auVar81._4_4_) - fVar90;
        *(float *)(uVar35 + 0xd0 + lVar27 * 4) =
             (ABS(auVar81._8_4_) * 4.7683716e-07 + auVar81._8_4_) - fVar88;
        *(float *)(uVar35 + 0xe0 + lVar27 * 4) = fVar79;
        *(uint *)(uVar35 + 0xf0 + lVar27 * 4) =
             ~-(uint)(fVar84 == 1.0) & (uint)fVar84 | -(uint)(fVar84 == 1.0) & 0x3f800001;
        lVar27 = lVar27 + 1;
        pfVar29 = pfVar29 + 0x18;
      } while (local_848 != lVar27);
    }
    uVar35 = (ulong)(uint)local_1e38._0_4_;
    uVar37 = local_1e68._0_8_;
    uVar55 = local_1e68._8_8_;
  }
  uVar18 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
  uVar17 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if ((char)uVar35 == '\0') {
    (local_1e10->ref).ptr = uVar49 | (ulong)pcVar34;
    *(undefined8 *)&(local_1e10->lbounds).bounds0.lower.field_0 = local_1e48._0_8_;
    *(undefined8 *)((long)&(local_1e10->lbounds).bounds0.lower.field_0 + 8) = local_1e48._8_8_;
    *(undefined8 *)&(local_1e10->lbounds).bounds0.upper.field_0 = local_1e28._0_8_;
    *(undefined8 *)((long)&(local_1e10->lbounds).bounds0.upper.field_0 + 8) = local_1e28._8_8_;
    *(undefined8 *)&(local_1e10->lbounds).bounds1.lower.field_0 = uVar37;
    *(undefined8 *)((long)&(local_1e10->lbounds).bounds1.lower.field_0 + 8) = uVar55;
    local_1ce8._0_8_ = local_1e88._0_8_;
    local_1ce8._8_8_ = local_1e88._8_8_;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    v1.field_0.v[0] = 0x7f8000007f800000;
    v1.field_0.v[1] = 0x7f8000007f800000;
    local_1b38._0_8_ = 0xff800000ff800000;
    local_1b38._8_8_ = 0xff800000ff800000;
    local_1b28 = 0x7f8000007f800000;
    sStack_1b20 = 0x7f8000007f800000;
    local_1b18 = 0xff800000ff800000;
    BStack_1b10.lower = -INFINITY;
    BStack_1b10.upper = -INFINITY;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      v0.field_0.v[0] = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      v0.field_0.v[1] = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&v2,(anon_class_16_2_aeee9775 *)&vSplitPos,(range<unsigned_long> *)&v0)
      ;
    }
    else {
      v0.field_0.v[1]._4_2_ = 0x401;
      local_1c68._0_8_ = 0;
      local_1c68._8_8_ = 0;
      local_1c48._0_8_ = 8;
      tbb::detail::r1::initialize((task_group_context *)&v0);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           uVar18;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           uVar17;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::QuadMesh>>(embree::sse2::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::QuadMesh>>(embree::sse2::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::QuadMesh>>(embree::sse2::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::QuadMesh>>(embree::sse2::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::QuadMesh>>(embree::sse2::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&v2,(d1 *)&right,(blocked_range<unsigned_long> *)&v1,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,(anon_class_1_0_00000001 *)&v0,
                 (task_group_context *)this);
      cVar19 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&v0);
      if (cVar19 != '\0') {
        prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar26,"task cancelled");
        __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&v0);
    }
    (local_1e10->ref).ptr = uVar49 | (ulong)pcVar34;
    *(longlong *)&(local_1e10->lbounds).bounds0.lower.field_0 = v2.field_0.v[0];
    *(longlong *)((long)&(local_1e10->lbounds).bounds0.lower.field_0 + 8) = v2.field_0.v[1];
    *(undefined8 *)&(local_1e10->lbounds).bounds0.upper.field_0 = local_1d08._0_8_;
    *(undefined8 *)((long)&(local_1e10->lbounds).bounds0.upper.field_0 + 8) = local_1d08._8_8_;
    *(undefined8 *)&(local_1e10->lbounds).bounds1.lower.field_0 = local_1cf8._0_8_;
    *(undefined8 *)((long)&(local_1e10->lbounds).bounds1.lower.field_0 + 8) = local_1cf8._8_8_;
  }
  *(undefined8 *)&(local_1e10->lbounds).bounds1.upper.field_0 = local_1ce8._0_8_;
  *(undefined8 *)((long)&(local_1e10->lbounds).bounds1.upper.field_0 + 8) = local_1ce8._8_8_;
  local_1e10->dt = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  if (local_848 == 0) {
    return local_1e10;
  }
  uVar35 = 0;
  do {
    pBVar9 = local_8c8[uVar35];
    pBVar47 = pBVar9 + 1;
    *pBVar47 = (BBox1f)((long)*pBVar47 + -1);
    if (*pBVar47 == (BBox1f)0x0) {
      BVar28 = *pBVar9;
      if (BVar28 != (BBox1f)0x0) {
        lVar27 = *(long *)((long)BVar28 + 0x18);
        pvVar23 = *(void **)((long)BVar28 + 0x20);
        if (pvVar23 != (void *)0x0) {
          if ((ulong)(lVar27 * 0x50) < 0x1c00000) {
            alignedFree(pvVar23);
          }
          else {
            os_free(pvVar23,lVar27 * 0x50,*(bool *)((long)BVar28 + 8));
          }
        }
        if (lVar27 != 0) {
          (**(code **)**(undefined8 **)BVar28)(*(undefined8 **)BVar28,lVar27 * -0x50,1);
        }
        *(undefined8 *)((long)BVar28 + 0x10) = 0;
        *(undefined8 *)((long)BVar28 + 0x18) = 0;
        *(undefined8 *)((long)BVar28 + 0x20) = 0;
      }
      operator_delete((void *)BVar28);
    }
    uVar35 = uVar35 + 1;
  } while (uVar35 < local_848);
  return local_1e10;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }